

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_mb_intersector.h
# Opt level: O2

void embree::sse2::CurveNiMBIntersector1<4>::
     intersect_n<embree::sse2::OrientedCurve1Intersector1<embree::BezierCurveT,3,4>,embree::sse2::Intersect1Epilog1<true>>
               (Precalculations *pre,RayHit *ray,RayQueryContext *context,Primitive *prim)

{
  long lVar1;
  long lVar2;
  float *pfVar3;
  float *pfVar4;
  float *pfVar5;
  float *pfVar6;
  float *pfVar7;
  Primitive *pPVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  undefined8 uVar12;
  ulong uVar13;
  Primitive PVar14;
  undefined4 uVar15;
  undefined4 uVar16;
  undefined4 uVar17;
  undefined4 uVar18;
  undefined4 uVar19;
  undefined4 uVar20;
  undefined4 uVar21;
  undefined4 uVar22;
  Geometry *pGVar23;
  __int_type_conflict _Var24;
  long lVar25;
  long lVar26;
  long lVar27;
  RTCFilterFunctionN p_Var28;
  bool bVar29;
  bool bVar30;
  undefined1 auVar31 [12];
  undefined1 auVar32 [12];
  undefined1 auVar33 [12];
  undefined1 auVar34 [12];
  undefined1 auVar35 [12];
  undefined1 auVar36 [12];
  undefined3 uVar37;
  undefined1 auVar38 [12];
  undefined1 auVar39 [12];
  undefined1 auVar40 [15];
  undefined1 auVar41 [15];
  undefined1 auVar42 [15];
  undefined1 auVar43 [15];
  undefined1 auVar44 [15];
  undefined1 auVar45 [15];
  undefined1 auVar46 [15];
  undefined1 auVar47 [15];
  undefined1 auVar48 [15];
  undefined1 auVar49 [15];
  undefined1 auVar50 [15];
  undefined1 auVar51 [15];
  undefined1 auVar52 [15];
  undefined1 auVar53 [15];
  undefined1 auVar54 [15];
  undefined1 auVar55 [15];
  undefined1 auVar56 [15];
  undefined1 auVar57 [15];
  undefined1 auVar58 [15];
  undefined1 auVar59 [15];
  undefined1 auVar60 [15];
  undefined1 auVar61 [15];
  undefined1 auVar62 [15];
  undefined1 auVar63 [15];
  undefined1 auVar64 [15];
  undefined1 auVar65 [15];
  undefined1 auVar66 [15];
  undefined1 auVar67 [15];
  undefined1 auVar68 [15];
  undefined1 auVar69 [15];
  undefined1 auVar70 [15];
  unkbyte9 Var71;
  undefined1 auVar72 [11];
  undefined1 auVar73 [13];
  undefined1 auVar74 [12];
  undefined1 auVar75 [13];
  undefined1 auVar76 [12];
  undefined1 auVar77 [13];
  undefined1 auVar78 [12];
  undefined1 auVar79 [13];
  undefined1 auVar80 [12];
  undefined1 auVar81 [12];
  undefined6 uVar82;
  undefined1 auVar83 [12];
  undefined1 auVar84 [12];
  undefined1 auVar85 [12];
  undefined1 auVar86 [12];
  undefined1 auVar87 [12];
  undefined1 auVar88 [12];
  undefined1 auVar89 [12];
  undefined1 auVar90 [12];
  undefined1 auVar91 [12];
  undefined1 auVar92 [12];
  undefined1 auVar93 [15];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [15];
  undefined1 auVar97 [15];
  undefined1 auVar98 [15];
  undefined1 auVar99 [15];
  undefined1 auVar100 [15];
  undefined1 auVar101 [15];
  undefined1 auVar102 [13];
  undefined1 auVar103 [15];
  byte bVar104;
  ulong uVar105;
  ulong uVar106;
  anon_union_16_2_47237d3f_for_Vec3fx_0 *paVar107;
  undefined4 uVar108;
  undefined8 unaff_RBP;
  long lVar110;
  long lVar111;
  ulong uVar112;
  bool bVar113;
  uint uVar114;
  uint uVar115;
  uint uVar116;
  uint uVar117;
  float fVar118;
  undefined2 uVar145;
  float fVar147;
  undefined1 auVar119 [12];
  float fVar146;
  vfloat_impl<4> p00;
  undefined1 auVar120 [16];
  undefined1 auVar122 [16];
  undefined1 auVar125 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  short sVar148;
  int iVar149;
  undefined1 auVar151 [12];
  undefined8 extraout_XMM1_Qa;
  undefined1 in_XMM1 [16];
  undefined1 auVar153 [16];
  int iVar184;
  char cVar187;
  undefined1 auVar157 [16];
  undefined1 auVar161 [16];
  undefined1 auVar152 [12];
  undefined1 auVar165 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined8 extraout_XMM1_Qa_00;
  undefined8 extraout_XMM1_Qb;
  undefined8 extraout_XMM1_Qb_00;
  undefined1 auVar183 [16];
  char cVar188;
  char cVar213;
  float t1;
  float fVar189;
  float fVar190;
  undefined2 uVar214;
  float fVar215;
  float fVar217;
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined2 uVar216;
  undefined1 auVar194 [16];
  undefined1 auVar197 [16];
  undefined1 auVar200 [16];
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  undefined1 auVar206 [16];
  undefined1 auVar207 [16];
  undefined1 auVar208 [16];
  undefined1 auVar209 [16];
  undefined1 auVar210 [16];
  undefined1 auVar211 [16];
  undefined1 auVar212 [16];
  char cVar228;
  float fVar218;
  float fVar219;
  undefined8 uVar220;
  float fVar229;
  float fVar231;
  undefined1 auVar223 [16];
  float fVar230;
  float fVar232;
  float fVar233;
  undefined1 auVar226 [16];
  undefined1 auVar227 [16];
  undefined1 auVar234 [12];
  vfloat4 a;
  undefined1 auVar235 [16];
  undefined1 auVar236 [16];
  undefined1 auVar240 [16];
  undefined1 auVar244 [16];
  undefined1 auVar245 [16];
  undefined1 auVar246 [16];
  undefined1 auVar247 [16];
  undefined1 auVar248 [16];
  undefined1 auVar249 [16];
  undefined1 auVar250 [16];
  undefined1 auVar251 [16];
  undefined1 auVar252 [16];
  undefined1 auVar253 [16];
  undefined1 auVar254 [16];
  float fVar255;
  float fVar266;
  float fVar267;
  undefined1 auVar256 [16];
  undefined1 auVar257 [16];
  undefined1 auVar258 [16];
  undefined1 auVar259 [16];
  undefined1 auVar260 [16];
  undefined1 auVar261 [16];
  undefined1 auVar262 [16];
  undefined1 auVar263 [16];
  undefined1 auVar264 [16];
  undefined1 auVar265 [16];
  float fVar269;
  undefined1 auVar268 [16];
  undefined1 auVar270 [12];
  float fVar289;
  undefined1 auVar272 [16];
  undefined1 auVar273 [16];
  undefined1 auVar271 [12];
  undefined1 auVar277 [16];
  undefined1 auVar281 [16];
  float fVar290;
  float fVar291;
  float fVar292;
  float fVar293;
  undefined1 auVar282 [16];
  undefined1 auVar283 [16];
  undefined1 auVar284 [16];
  undefined1 auVar285 [16];
  undefined1 auVar286 [16];
  undefined1 auVar287 [16];
  undefined1 auVar288 [16];
  float fVar294;
  float fVar295;
  undefined1 uVar307;
  float fVar308;
  float fVar310;
  undefined1 auVar296 [16];
  float fVar309;
  float fVar311;
  float fVar312;
  undefined1 auVar299 [16];
  undefined1 auVar300 [16];
  undefined1 auVar301 [16];
  undefined1 auVar302 [16];
  undefined1 auVar303 [16];
  undefined1 auVar304 [16];
  undefined1 auVar305 [16];
  undefined1 auVar306 [16];
  float fVar313;
  float fVar329;
  float fVar332;
  undefined1 auVar316 [12];
  undefined1 auVar317 [16];
  float fVar314;
  float fVar315;
  undefined1 auVar321 [16];
  float fVar330;
  float fVar331;
  float fVar333;
  float fVar334;
  float fVar335;
  float fVar336;
  undefined1 auVar322 [16];
  undefined1 auVar323 [16];
  undefined1 auVar324 [16];
  undefined1 auVar325 [16];
  undefined1 auVar326 [16];
  undefined1 auVar327 [16];
  undefined1 auVar328 [16];
  float fVar337;
  float fVar338;
  float fVar345;
  float fVar349;
  vfloat4 a_1;
  undefined1 auVar339 [16];
  float fVar346;
  float fVar347;
  float fVar348;
  float fVar350;
  float fVar351;
  float fVar352;
  float fVar353;
  float fVar354;
  float fVar355;
  float fVar356;
  undefined1 auVar340 [16];
  undefined1 auVar341 [16];
  undefined1 auVar342 [16];
  undefined1 auVar343 [16];
  undefined1 auVar344 [16];
  float fVar357;
  float fVar358;
  float fVar365;
  float fVar367;
  vfloat4 a_2;
  undefined1 auVar359 [16];
  float fVar366;
  float fVar368;
  float fVar369;
  undefined1 auVar360 [16];
  undefined1 auVar361 [16];
  undefined1 auVar362 [16];
  undefined1 auVar363 [16];
  undefined1 auVar364 [16];
  float fVar370;
  float fVar371;
  float fVar379;
  float fVar381;
  undefined1 auVar372 [16];
  undefined1 auVar375 [16];
  float fVar380;
  float fVar382;
  float fVar383;
  undefined1 auVar376 [16];
  undefined1 auVar377 [16];
  undefined1 auVar378 [16];
  float fVar384;
  float fVar391;
  float fVar392;
  undefined1 auVar385 [16];
  float fVar393;
  undefined1 auVar388 [16];
  undefined1 auVar389 [16];
  undefined1 auVar390 [16];
  float fVar394;
  float fVar400;
  float fVar401;
  float fVar402;
  undefined1 auVar395 [16];
  undefined1 auVar396 [16];
  undefined1 auVar397 [16];
  undefined1 auVar398 [16];
  undefined1 auVar399 [16];
  float fVar403;
  float fVar409;
  float fVar410;
  undefined1 auVar404 [16];
  float fVar411;
  undefined1 auVar407 [16];
  undefined1 auVar408 [16];
  vfloat_impl<4> p02;
  vfloat_impl<4> p01;
  vfloat_impl<4> p00_1;
  RTCFilterFunctionNArguments args;
  uint mask_stack [4];
  vfloat_impl<4> p03;
  BBox1f cu_stack [4];
  BBox1f cv_stack [4];
  undefined1 local_428 [8];
  float fStack_420;
  float fStack_41c;
  undefined8 local_408;
  undefined1 local_3f8 [8];
  float fStack_3f0;
  float fStack_3ec;
  undefined8 local_3e8;
  anon_union_16_2_47237d3f_for_Vec3fx_0 local_3dc;
  float fStack_3cc;
  float local_3c8;
  float fStack_3c4;
  float fStack_3c0;
  float fStack_3bc;
  float local_3b8;
  float fStack_3b4;
  float fStack_3b0;
  float fStack_3ac;
  float local_3a8;
  float fStack_3a4;
  float fStack_3a0;
  float fStack_39c;
  float local_398;
  float fStack_394;
  float fStack_390;
  float fStack_38c;
  float local_388;
  float fStack_384;
  float fStack_380;
  float fStack_37c;
  float local_378;
  float fStack_374;
  float fStack_370;
  float fStack_36c;
  undefined1 local_368 [8];
  float fStack_360;
  float fStack_35c;
  ulong local_350;
  undefined8 local_348;
  undefined8 uStack_340;
  undefined1 local_338 [8];
  float fStack_330;
  float fStack_32c;
  float local_328;
  float fStack_324;
  float fStack_320;
  float fStack_31c;
  undefined1 local_318 [8];
  float fStack_310;
  float fStack_30c;
  float local_308;
  float fStack_304;
  float fStack_300;
  float fStack_2fc;
  undefined1 local_2f8 [8];
  float fStack_2f0;
  float fStack_2ec;
  undefined1 local_2e8 [16];
  undefined1 local_2d8 [16];
  undefined8 local_2c8;
  float fStack_2c0;
  float fStack_2bc;
  float local_2b8;
  float fStack_2b4;
  undefined8 uStack_2b0;
  undefined8 local_2a8;
  float fStack_2a0;
  float fStack_29c;
  float fStack_298;
  float fStack_294;
  Primitive *local_290;
  RTCFilterFunctionNArguments local_288;
  float local_258;
  float fStack_254;
  float fStack_250;
  float fStack_24c;
  undefined1 local_248 [16];
  float local_238;
  float fStack_234;
  float fStack_230;
  float fStack_22c;
  undefined1 local_228 [16];
  float local_218;
  float fStack_214;
  float fStack_210;
  float fStack_20c;
  uint auStack_208 [4];
  undefined8 local_1f8;
  float local_1f0;
  float local_1ec;
  float fStack_1e8;
  uint local_1e4;
  float local_1e0;
  uint local_1dc;
  uint local_1d8;
  float local_1c8;
  float fStack_1c4;
  float fStack_1c0;
  float fStack_1bc;
  float local_1b8;
  float fStack_1b4;
  float fStack_1b0;
  float fStack_1ac;
  float local_1a8;
  float fStack_1a4;
  float fStack_1a0;
  float fStack_19c;
  float local_198;
  float fStack_194;
  float fStack_190;
  float fStack_18c;
  float local_188;
  float fStack_184;
  float fStack_180;
  float fStack_17c;
  undefined1 local_178 [16];
  float local_168;
  float fStack_164;
  float fStack_160;
  float fStack_15c;
  float local_158;
  float fStack_154;
  float fStack_150;
  float fStack_14c;
  float local_148;
  float fStack_144;
  float fStack_140;
  float fStack_13c;
  float local_138;
  float fStack_134;
  float fStack_130;
  float fStack_12c;
  undefined1 local_128 [16];
  undefined1 local_118 [16];
  float local_108;
  float fStack_104;
  float fStack_100;
  float fStack_fc;
  undefined1 local_f8 [16];
  undefined1 local_e8 [16];
  undefined1 local_d8 [16];
  float local_c8;
  float fStack_c4;
  float fStack_c0;
  float fStack_bc;
  undefined1 local_b8 [16];
  float local_a8;
  float fStack_a4;
  float fStack_a0;
  float fStack_9c;
  float local_98;
  float fStack_94;
  float fStack_90;
  float fStack_8c;
  float local_88;
  float fStack_84;
  float fStack_80;
  float fStack_7c;
  float afStack_78 [8];
  float afStack_58 [10];
  ulong uVar109;
  undefined1 auVar121 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar150 [12];
  undefined1 auVar154 [16];
  undefined1 auVar158 [16];
  undefined1 auVar162 [16];
  undefined1 auVar166 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar167 [16];
  int iVar185;
  int iVar186;
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  undefined1 auVar221 [12];
  undefined1 auVar224 [16];
  undefined1 auVar222 [16];
  undefined1 auVar225 [16];
  undefined1 auVar237 [16];
  undefined1 auVar241 [16];
  undefined1 auVar238 [16];
  undefined1 auVar242 [16];
  undefined1 auVar239 [16];
  undefined1 auVar243 [16];
  undefined1 auVar274 [16];
  undefined1 auVar278 [16];
  undefined1 auVar275 [16];
  undefined1 auVar279 [16];
  undefined1 auVar276 [16];
  undefined1 auVar280 [16];
  undefined1 auVar297 [16];
  undefined1 auVar298 [16];
  undefined1 auVar318 [16];
  undefined1 auVar319 [16];
  undefined1 auVar320 [16];
  undefined1 auVar373 [16];
  undefined1 auVar374 [16];
  undefined1 auVar386 [16];
  undefined1 auVar387 [16];
  undefined1 auVar405 [16];
  undefined1 auVar406 [16];
  
  PVar14 = prim[1];
  uVar105 = (ulong)(byte)PVar14;
  lVar111 = uVar105 * 0x25;
  uVar108 = *(undefined4 *)(prim + uVar105 * 4 + 6);
  uVar15 = *(undefined4 *)(prim + uVar105 * 5 + 6);
  uVar16 = *(undefined4 *)(prim + uVar105 * 6 + 6);
  uVar17 = *(undefined4 *)(prim + uVar105 * 0xf + 6);
  uVar18 = *(undefined4 *)(prim + (ulong)(byte)PVar14 * 0x10 + 6);
  uVar19 = *(undefined4 *)(prim + uVar105 * 0x11 + 6);
  uVar20 = *(undefined4 *)(prim + uVar105 * 0x1a + 6);
  uVar21 = *(undefined4 *)(prim + uVar105 * 0x1b + 6);
  pPVar8 = prim + lVar111 + 6;
  fVar367 = *(float *)(pPVar8 + 0xc);
  fVar118 = ((ray->super_RayK<1>).org.field_0.m128[0] - *(float *)pPVar8) * fVar367;
  fVar146 = ((ray->super_RayK<1>).org.field_0.m128[1] - *(float *)(pPVar8 + 4)) * fVar367;
  fVar147 = ((ray->super_RayK<1>).org.field_0.m128[2] - *(float *)(pPVar8 + 8)) * fVar367;
  fVar357 = fVar367 * (ray->super_RayK<1>).dir.field_0.m128[0];
  fVar365 = fVar367 * (ray->super_RayK<1>).dir.field_0.m128[1];
  fVar367 = fVar367 * (ray->super_RayK<1>).dir.field_0.m128[2];
  uVar22 = *(undefined4 *)(prim + uVar105 * 0x1c + 6);
  auVar40[0xd] = 0;
  auVar40._0_13_ = in_XMM1._0_13_;
  auVar40[0xe] = in_XMM1[7];
  auVar44[0xc] = in_XMM1[6];
  auVar44._0_12_ = in_XMM1._0_12_;
  auVar44._13_2_ = auVar40._13_2_;
  auVar48[0xb] = 0;
  auVar48._0_11_ = in_XMM1._0_11_;
  auVar48._12_3_ = auVar44._12_3_;
  auVar52[10] = in_XMM1[5];
  auVar52._0_10_ = in_XMM1._0_10_;
  auVar52._11_4_ = auVar48._11_4_;
  auVar56[9] = 0;
  auVar56._0_9_ = in_XMM1._0_9_;
  auVar56._10_5_ = auVar52._10_5_;
  auVar60[8] = in_XMM1[4];
  auVar60._0_8_ = in_XMM1._0_8_;
  auVar60._9_6_ = auVar56._9_6_;
  Var71 = CONCAT81(CONCAT71(auVar60._8_7_,(char)((uint)uVar15 >> 0x18)),in_XMM1[3]);
  auVar72._2_9_ = Var71;
  auVar72[1] = (char)((uint)uVar15 >> 0x10);
  auVar72[0] = in_XMM1[2];
  cVar213 = (char)((uint)uVar15 >> 8);
  auVar73._2_11_ = auVar72;
  auVar73[1] = cVar213;
  auVar73[0] = in_XMM1[1];
  cVar188 = (char)uVar15;
  sVar148 = CONCAT11(cVar188,in_XMM1[0]);
  auVar67._2_13_ = auVar73;
  auVar67._0_2_ = sVar148;
  uVar145 = (undefined2)Var71;
  auVar155._0_12_ = auVar67._0_12_;
  auVar155._12_2_ = uVar145;
  auVar155._14_2_ = uVar145;
  auVar154._12_4_ = auVar155._12_4_;
  auVar154._0_10_ = auVar67._0_10_;
  auVar154._10_2_ = auVar72._0_2_;
  auVar153._10_6_ = auVar154._10_6_;
  auVar153._0_8_ = auVar67._0_8_;
  auVar153._8_2_ = auVar72._0_2_;
  auVar74._4_8_ = auVar153._8_8_;
  auVar74._2_2_ = auVar73._0_2_;
  auVar74._0_2_ = auVar73._0_2_;
  iVar149 = (int)sVar148 >> 8;
  iVar184 = auVar74._0_4_ >> 0x18;
  auVar150._0_8_ = CONCAT44(iVar184,iVar149);
  auVar150._8_4_ = auVar153._8_4_ >> 0x18;
  auVar156._12_4_ = auVar154._12_4_ >> 0x18;
  auVar156._0_12_ = auVar150;
  fVar269 = (float)iVar184;
  cVar187 = cVar213 >> 7;
  auVar41[0xd] = 0;
  auVar41._0_13_ = auVar156._0_13_;
  auVar41[0xe] = cVar187;
  auVar45[0xc] = cVar187;
  auVar45._0_12_ = auVar150;
  auVar45._13_2_ = auVar41._13_2_;
  auVar49[0xb] = 0;
  auVar49._0_11_ = auVar150._0_11_;
  auVar49._12_3_ = auVar45._12_3_;
  auVar53[10] = cVar187;
  auVar53._0_10_ = auVar150._0_10_;
  auVar53._11_4_ = auVar49._11_4_;
  auVar57[9] = 0;
  auVar57._0_9_ = auVar150._0_9_;
  auVar57._10_5_ = auVar53._10_5_;
  auVar61[8] = cVar213;
  auVar61._0_8_ = auVar150._0_8_;
  auVar61._9_6_ = auVar57._9_6_;
  Var71 = CONCAT81(CONCAT71(auVar61._8_7_,(char)((uint)uVar16 >> 0x18)),(short)cVar188 >> 7);
  auVar64._6_9_ = Var71;
  auVar64[5] = (char)((uint)uVar16 >> 0x10);
  auVar64[4] = (undefined1)((short)cVar188 >> 7);
  auVar64._0_4_ = iVar149;
  cVar228 = (char)((uint)uVar16 >> 8);
  auVar75._2_11_ = auVar64._4_11_;
  auVar75[1] = cVar228;
  auVar75[0] = (undefined1)((short)cVar188 >> 7);
  cVar213 = (char)uVar16;
  auVar68._2_13_ = auVar75;
  auVar68._0_2_ = CONCAT11(cVar213,cVar188);
  uVar145 = (undefined2)Var71;
  auVar159._0_12_ = auVar68._0_12_;
  auVar159._12_2_ = uVar145;
  auVar159._14_2_ = uVar145;
  auVar158._12_4_ = auVar159._12_4_;
  auVar158._0_10_ = auVar68._0_10_;
  auVar158._10_2_ = auVar64._4_2_;
  auVar157._10_6_ = auVar158._10_6_;
  auVar157._0_8_ = auVar68._0_8_;
  auVar157._8_2_ = auVar64._4_2_;
  auVar76._4_8_ = auVar157._8_8_;
  auVar76._2_2_ = auVar75._0_2_;
  auVar76._0_2_ = auVar75._0_2_;
  iVar184 = (int)CONCAT11(cVar213,cVar188) >> 8;
  iVar185 = auVar76._0_4_ >> 0x18;
  auVar151._0_8_ = CONCAT44(iVar185,iVar184);
  auVar151._8_4_ = auVar157._8_4_ >> 0x18;
  auVar160._12_4_ = auVar158._12_4_ >> 0x18;
  auVar160._0_12_ = auVar151;
  fVar345 = (float)iVar185;
  cVar187 = cVar228 >> 7;
  auVar42[0xd] = 0;
  auVar42._0_13_ = auVar160._0_13_;
  auVar42[0xe] = cVar187;
  auVar46[0xc] = cVar187;
  auVar46._0_12_ = auVar151;
  auVar46._13_2_ = auVar42._13_2_;
  auVar50[0xb] = 0;
  auVar50._0_11_ = auVar151._0_11_;
  auVar50._12_3_ = auVar46._12_3_;
  auVar54[10] = cVar187;
  auVar54._0_10_ = auVar151._0_10_;
  auVar54._11_4_ = auVar50._11_4_;
  auVar58[9] = 0;
  auVar58._0_9_ = auVar151._0_9_;
  auVar58._10_5_ = auVar54._10_5_;
  auVar62[8] = cVar228;
  auVar62._0_8_ = auVar151._0_8_;
  auVar62._9_6_ = auVar58._9_6_;
  Var71 = CONCAT81(CONCAT71(auVar62._8_7_,(char)((uint)uVar18 >> 0x18)),(short)cVar213 >> 7);
  auVar65._6_9_ = Var71;
  auVar65[5] = (char)((uint)uVar18 >> 0x10);
  auVar65[4] = (undefined1)((short)cVar213 >> 7);
  auVar65._0_4_ = iVar184;
  cVar228 = (char)((uint)uVar18 >> 8);
  auVar77._2_11_ = auVar65._4_11_;
  auVar77[1] = cVar228;
  auVar77[0] = (undefined1)((short)cVar213 >> 7);
  cVar188 = (char)uVar18;
  auVar69._2_13_ = auVar77;
  auVar69._0_2_ = CONCAT11(cVar188,cVar213);
  uVar145 = (undefined2)Var71;
  auVar163._0_12_ = auVar69._0_12_;
  auVar163._12_2_ = uVar145;
  auVar163._14_2_ = uVar145;
  auVar162._12_4_ = auVar163._12_4_;
  auVar162._0_10_ = auVar69._0_10_;
  auVar162._10_2_ = auVar65._4_2_;
  auVar161._10_6_ = auVar162._10_6_;
  auVar161._0_8_ = auVar69._0_8_;
  auVar161._8_2_ = auVar65._4_2_;
  auVar78._4_8_ = auVar161._8_8_;
  auVar78._2_2_ = auVar77._0_2_;
  auVar78._0_2_ = auVar77._0_2_;
  iVar185 = (int)CONCAT11(cVar188,cVar213) >> 8;
  iVar186 = auVar78._0_4_ >> 0x18;
  auVar152._0_8_ = CONCAT44(iVar186,iVar185);
  auVar152._8_4_ = auVar161._8_4_ >> 0x18;
  auVar164._12_4_ = auVar162._12_4_ >> 0x18;
  auVar164._0_12_ = auVar152;
  fVar289 = (float)iVar186;
  cVar187 = cVar228 >> 7;
  auVar43[0xd] = 0;
  auVar43._0_13_ = auVar164._0_13_;
  auVar43[0xe] = cVar187;
  auVar47[0xc] = cVar187;
  auVar47._0_12_ = auVar152;
  auVar47._13_2_ = auVar43._13_2_;
  auVar51[0xb] = 0;
  auVar51._0_11_ = auVar152._0_11_;
  auVar51._12_3_ = auVar47._12_3_;
  auVar55[10] = cVar187;
  auVar55._0_10_ = auVar152._0_10_;
  auVar55._11_4_ = auVar51._11_4_;
  auVar59[9] = 0;
  auVar59._0_9_ = auVar152._0_9_;
  auVar59._10_5_ = auVar55._10_5_;
  auVar63[8] = cVar228;
  auVar63._0_8_ = auVar152._0_8_;
  auVar63._9_6_ = auVar59._9_6_;
  Var71 = CONCAT81(CONCAT71(auVar63._8_7_,(char)((uint)uVar19 >> 0x18)),(short)cVar188 >> 7);
  auVar66._6_9_ = Var71;
  auVar66[5] = (char)((uint)uVar19 >> 0x10);
  auVar66[4] = (undefined1)((short)cVar188 >> 7);
  auVar66._0_4_ = iVar185;
  auVar79._2_11_ = auVar66._4_11_;
  auVar79[1] = (char)((uint)uVar19 >> 8);
  auVar79[0] = (undefined1)((short)cVar188 >> 7);
  sVar148 = CONCAT11((char)uVar19,cVar188);
  auVar70._2_13_ = auVar79;
  auVar70._0_2_ = sVar148;
  uVar145 = (undefined2)Var71;
  auVar167._0_12_ = auVar70._0_12_;
  auVar167._12_2_ = uVar145;
  auVar167._14_2_ = uVar145;
  auVar166._12_4_ = auVar167._12_4_;
  auVar166._0_10_ = auVar70._0_10_;
  auVar166._10_2_ = auVar66._4_2_;
  auVar165._10_6_ = auVar166._10_6_;
  auVar165._0_8_ = auVar70._0_8_;
  auVar165._8_2_ = auVar66._4_2_;
  auVar80._4_8_ = auVar165._8_8_;
  auVar80._2_2_ = auVar79._0_2_;
  auVar80._0_2_ = auVar79._0_2_;
  fVar313 = (float)((int)sVar148 >> 8);
  fVar329 = (float)(auVar80._0_4_ >> 0x18);
  fVar332 = (float)(auVar165._8_4_ >> 0x18);
  fVar218 = fVar367 * fVar313;
  fVar229 = fVar367 * fVar329;
  auVar221._0_8_ = CONCAT44(fVar229,fVar218);
  auVar221._8_4_ = fVar367 * fVar332;
  auVar222._12_4_ = fVar367 * (float)(auVar166._12_4_ >> 0x18);
  auVar222._0_12_ = auVar221;
  fVar189 = ((ray->super_RayK<1>).dir.field_0.m128[3] - *(float *)(prim + lVar111 + 0x16)) *
            *(float *)(prim + lVar111 + 0x1a);
  local_428[0] = (undefined1)uVar108;
  local_428[1] = (undefined1)((uint)uVar108 >> 8);
  local_428[2] = (undefined1)((uint)uVar108 >> 0x10);
  local_428[3] = (undefined1)((uint)uVar108 >> 0x18);
  auVar93[0xd] = 0;
  auVar93._0_13_ = auVar222._0_13_;
  auVar93[0xe] = (char)((uint)fVar229 >> 0x18);
  auVar96[0xc] = (char)((uint)fVar229 >> 0x10);
  auVar96._0_12_ = auVar221;
  auVar96._13_2_ = auVar93._13_2_;
  auVar97[0xb] = 0;
  auVar97._0_11_ = auVar221._0_11_;
  auVar97._12_3_ = auVar96._12_3_;
  auVar98[10] = (char)((uint)fVar229 >> 8);
  auVar98._0_10_ = auVar221._0_10_;
  auVar98._11_4_ = auVar97._11_4_;
  auVar99[9] = 0;
  auVar99._0_9_ = auVar221._0_9_;
  auVar99._10_5_ = auVar98._10_5_;
  auVar100[8] = SUB41(fVar229,0);
  auVar100._0_8_ = auVar221._0_8_;
  auVar100._9_6_ = auVar99._9_6_;
  Var71 = CONCAT81(CONCAT71(auVar100._8_7_,local_428[3]),(char)((uint)fVar218 >> 0x18));
  auVar101._6_9_ = Var71;
  auVar101[5] = local_428[2];
  auVar101[4] = (char)((uint)fVar218 >> 0x10);
  auVar101._0_4_ = fVar218;
  auVar102._2_11_ = auVar101._4_11_;
  auVar102[1] = local_428[1];
  auVar102[0] = (char)((uint)fVar218 >> 8);
  sVar148 = CONCAT11(local_428[0],SUB41(fVar218,0));
  auVar103._2_13_ = auVar102;
  auVar103._0_2_ = sVar148;
  uVar145 = (undefined2)Var71;
  auVar225._0_12_ = auVar103._0_12_;
  auVar225._12_2_ = uVar145;
  auVar225._14_2_ = uVar145;
  auVar224._12_4_ = auVar225._12_4_;
  auVar224._0_10_ = auVar103._0_10_;
  auVar224._10_2_ = auVar101._4_2_;
  auVar223._10_6_ = auVar224._10_6_;
  auVar223._0_8_ = auVar103._0_8_;
  auVar223._8_2_ = auVar101._4_2_;
  auVar81._4_8_ = auVar223._8_8_;
  auVar81._2_2_ = auVar102._0_2_;
  auVar81._0_2_ = auVar102._0_2_;
  fVar219 = (float)((int)sVar148 >> 8);
  fVar230 = (float)(auVar81._0_4_ >> 0x18);
  fVar231 = (float)(auVar223._8_4_ >> 0x18);
  uVar307 = (undefined1)((uint)uVar17 >> 0x18);
  uVar145 = CONCAT11(uVar307,uVar307);
  uVar307 = (undefined1)((uint)uVar17 >> 0x10);
  uVar220 = CONCAT35(CONCAT21(uVar145,uVar307),CONCAT14(uVar307,uVar17));
  uVar307 = (undefined1)((uint)uVar17 >> 8);
  uVar82 = CONCAT51(CONCAT41((int)((ulong)uVar220 >> 0x20),uVar307),uVar307);
  sVar148 = CONCAT11((char)uVar17,(char)uVar17);
  uVar109 = CONCAT62(uVar82,sVar148);
  auVar387._8_4_ = 0;
  auVar387._0_8_ = uVar109;
  auVar387._12_2_ = uVar145;
  auVar387._14_2_ = uVar145;
  uVar145 = (undefined2)((ulong)uVar220 >> 0x20);
  auVar386._12_4_ = auVar387._12_4_;
  auVar386._8_2_ = 0;
  auVar386._0_8_ = uVar109;
  auVar386._10_2_ = uVar145;
  auVar385._10_6_ = auVar386._10_6_;
  auVar385._8_2_ = uVar145;
  auVar385._0_8_ = uVar109;
  uVar145 = (undefined2)uVar82;
  auVar83._4_8_ = auVar385._8_8_;
  auVar83._2_2_ = uVar145;
  auVar83._0_2_ = uVar145;
  fVar384 = (float)((int)sVar148 >> 8);
  fVar391 = (float)(auVar83._0_4_ >> 0x18);
  fVar392 = (float)(auVar385._8_4_ >> 0x18);
  uVar307 = (undefined1)((uint)uVar20 >> 0x18);
  uVar145 = CONCAT11(uVar307,uVar307);
  uVar307 = (undefined1)((uint)uVar20 >> 0x10);
  uVar220 = CONCAT35(CONCAT21(uVar145,uVar307),CONCAT14(uVar307,uVar20));
  uVar307 = (undefined1)((uint)uVar20 >> 8);
  uVar82 = CONCAT51(CONCAT41((int)((ulong)uVar220 >> 0x20),uVar307),uVar307);
  sVar148 = CONCAT11((char)uVar20,(char)uVar20);
  uVar109 = CONCAT62(uVar82,sVar148);
  auVar298._8_4_ = 0;
  auVar298._0_8_ = uVar109;
  auVar298._12_2_ = uVar145;
  auVar298._14_2_ = uVar145;
  uVar145 = (undefined2)((ulong)uVar220 >> 0x20);
  auVar297._12_4_ = auVar298._12_4_;
  auVar297._8_2_ = 0;
  auVar297._0_8_ = uVar109;
  auVar297._10_2_ = uVar145;
  auVar296._10_6_ = auVar297._10_6_;
  auVar296._8_2_ = uVar145;
  auVar296._0_8_ = uVar109;
  uVar145 = (undefined2)uVar82;
  auVar84._4_8_ = auVar296._8_8_;
  auVar84._2_2_ = uVar145;
  auVar84._0_2_ = uVar145;
  fVar294 = (float)((int)sVar148 >> 8);
  fVar308 = (float)(auVar84._0_4_ >> 0x18);
  fVar310 = (float)(auVar296._8_4_ >> 0x18);
  uVar307 = (undefined1)((uint)uVar21 >> 0x18);
  uVar145 = CONCAT11(uVar307,uVar307);
  uVar307 = (undefined1)((uint)uVar21 >> 0x10);
  uVar220 = CONCAT35(CONCAT21(uVar145,uVar307),CONCAT14(uVar307,uVar21));
  uVar307 = (undefined1)((uint)uVar21 >> 8);
  uVar82 = CONCAT51(CONCAT41((int)((ulong)uVar220 >> 0x20),uVar307),uVar307);
  sVar148 = CONCAT11((char)uVar21,(char)uVar21);
  uVar109 = CONCAT62(uVar82,sVar148);
  auVar374._8_4_ = 0;
  auVar374._0_8_ = uVar109;
  auVar374._12_2_ = uVar145;
  auVar374._14_2_ = uVar145;
  uVar145 = (undefined2)((ulong)uVar220 >> 0x20);
  auVar373._12_4_ = auVar374._12_4_;
  auVar373._8_2_ = 0;
  auVar373._0_8_ = uVar109;
  auVar373._10_2_ = uVar145;
  auVar372._10_6_ = auVar373._10_6_;
  auVar372._8_2_ = uVar145;
  auVar372._0_8_ = uVar109;
  uVar145 = (undefined2)uVar82;
  auVar85._4_8_ = auVar372._8_8_;
  auVar85._2_2_ = uVar145;
  auVar85._0_2_ = uVar145;
  fVar370 = (float)((int)sVar148 >> 8);
  fVar379 = (float)(auVar85._0_4_ >> 0x18);
  fVar381 = (float)(auVar372._8_4_ >> 0x18);
  uVar307 = (undefined1)((uint)uVar22 >> 0x18);
  uVar145 = CONCAT11(uVar307,uVar307);
  uVar307 = (undefined1)((uint)uVar22 >> 0x10);
  uVar220 = CONCAT35(CONCAT21(uVar145,uVar307),CONCAT14(uVar307,uVar22));
  uVar307 = (undefined1)((uint)uVar22 >> 8);
  uVar82 = CONCAT51(CONCAT41((int)((ulong)uVar220 >> 0x20),uVar307),uVar307);
  sVar148 = CONCAT11((char)uVar22,(char)uVar22);
  uVar109 = CONCAT62(uVar82,sVar148);
  auVar406._8_4_ = 0;
  auVar406._0_8_ = uVar109;
  auVar406._12_2_ = uVar145;
  auVar406._14_2_ = uVar145;
  uVar145 = (undefined2)((ulong)uVar220 >> 0x20);
  auVar405._12_4_ = auVar406._12_4_;
  auVar405._8_2_ = 0;
  auVar405._0_8_ = uVar109;
  auVar405._10_2_ = uVar145;
  auVar404._10_6_ = auVar405._10_6_;
  auVar404._8_2_ = uVar145;
  auVar404._0_8_ = uVar109;
  uVar145 = (undefined2)uVar82;
  auVar86._4_8_ = auVar404._8_8_;
  auVar86._2_2_ = uVar145;
  auVar86._0_2_ = uVar145;
  fVar190 = (float)((int)sVar148 >> 8);
  fVar215 = (float)(auVar86._0_4_ >> 0x18);
  fVar217 = (float)(auVar404._8_4_ >> 0x18);
  fVar403 = fVar357 * fVar219 + fVar365 * (float)iVar149 + fVar367 * (float)iVar184;
  fVar409 = fVar357 * fVar230 + fVar365 * fVar269 + fVar367 * fVar345;
  fVar410 = fVar357 * fVar231 + fVar365 * (float)auVar150._8_4_ + fVar367 * (float)auVar151._8_4_;
  fVar411 = fVar357 * (float)(auVar224._12_4_ >> 0x18) +
            fVar365 * (float)auVar156._12_4_ + fVar367 * (float)auVar160._12_4_;
  fVar394 = fVar357 * fVar384 + fVar365 * (float)iVar185 + fVar218;
  fVar400 = fVar357 * fVar391 + fVar365 * fVar289 + fVar229;
  fVar401 = fVar357 * fVar392 + fVar365 * (float)auVar152._8_4_ + auVar221._8_4_;
  fVar402 = fVar357 * (float)(auVar386._12_4_ >> 0x18) +
            fVar365 * (float)auVar164._12_4_ + auVar222._12_4_;
  fVar255 = fVar357 * fVar294 + fVar365 * fVar370 + fVar367 * fVar190;
  fVar266 = fVar357 * fVar308 + fVar365 * fVar379 + fVar367 * fVar215;
  fVar267 = fVar357 * fVar310 + fVar365 * fVar381 + fVar367 * fVar217;
  fVar357 = fVar357 * (float)(auVar297._12_4_ >> 0x18) +
            fVar365 * (float)(auVar373._12_4_ >> 0x18) + fVar367 * (float)(auVar405._12_4_ >> 0x18);
  uVar220 = *(undefined8 *)(prim + uVar105 * 7 + 6);
  uVar9 = *(undefined8 *)(prim + uVar105 * 0xb + 6);
  uVar10 = *(undefined8 *)(prim + uVar105 * 9 + 6);
  uVar11 = *(undefined8 *)(prim + uVar105 * 0xd + 6);
  uVar109 = *(ulong *)(prim + uVar105 * 0x12 + 6);
  fVar365 = fVar219 * fVar118 + (float)iVar149 * fVar146 + (float)iVar184 * fVar147;
  fVar345 = fVar230 * fVar118 + fVar269 * fVar146 + fVar345 * fVar147;
  fVar232 = fVar231 * fVar118 + (float)auVar150._8_4_ * fVar146 + (float)auVar151._8_4_ * fVar147;
  fVar233 = (float)(auVar224._12_4_ >> 0x18) * fVar118 +
            (float)auVar156._12_4_ * fVar146 + (float)auVar160._12_4_ * fVar147;
  fVar384 = fVar384 * fVar118 + (float)iVar185 * fVar146 + fVar313 * fVar147;
  fVar391 = fVar391 * fVar118 + fVar289 * fVar146 + fVar329 * fVar147;
  fVar392 = fVar392 * fVar118 + (float)auVar152._8_4_ * fVar146 + fVar332 * fVar147;
  fVar393 = (float)(auVar386._12_4_ >> 0x18) * fVar118 +
            (float)auVar164._12_4_ * fVar146 + (float)(auVar166._12_4_ >> 0x18) * fVar147;
  fVar218 = fVar118 * fVar294 + fVar146 * fVar370 + fVar147 * fVar190;
  fVar219 = fVar118 * fVar308 + fVar146 * fVar379 + fVar147 * fVar215;
  fVar229 = fVar118 * fVar310 + fVar146 * fVar381 + fVar147 * fVar217;
  fVar230 = fVar118 * (float)(auVar297._12_4_ >> 0x18) +
            fVar146 * (float)(auVar373._12_4_ >> 0x18) + fVar147 * (float)(auVar405._12_4_ >> 0x18);
  fVar367 = (float)DAT_01f4bd50;
  fVar118 = DAT_01f4bd50._4_4_;
  fVar146 = DAT_01f4bd50._8_4_;
  fVar147 = DAT_01f4bd50._12_4_;
  uVar114 = -(uint)(fVar367 <= ABS(fVar403));
  uVar115 = -(uint)(fVar118 <= ABS(fVar409));
  uVar116 = -(uint)(fVar146 <= ABS(fVar410));
  uVar117 = -(uint)(fVar147 <= ABS(fVar411));
  auVar407._0_4_ = (uint)fVar403 & uVar114;
  auVar407._4_4_ = (uint)fVar409 & uVar115;
  auVar407._8_4_ = (uint)fVar410 & uVar116;
  auVar407._12_4_ = (uint)fVar411 & uVar117;
  auVar191._0_4_ = ~uVar114 & (uint)fVar367;
  auVar191._4_4_ = ~uVar115 & (uint)fVar118;
  auVar191._8_4_ = ~uVar116 & (uint)fVar146;
  auVar191._12_4_ = ~uVar117 & (uint)fVar147;
  auVar191 = auVar191 | auVar407;
  uVar114 = -(uint)(fVar367 <= ABS(fVar394));
  uVar115 = -(uint)(fVar118 <= ABS(fVar400));
  uVar116 = -(uint)(fVar146 <= ABS(fVar401));
  uVar117 = -(uint)(fVar147 <= ABS(fVar402));
  auVar395._0_4_ = (uint)fVar394 & uVar114;
  auVar395._4_4_ = (uint)fVar400 & uVar115;
  auVar395._8_4_ = (uint)fVar401 & uVar116;
  auVar395._12_4_ = (uint)fVar402 & uVar117;
  auVar272._0_4_ = ~uVar114 & (uint)fVar367;
  auVar272._4_4_ = ~uVar115 & (uint)fVar118;
  auVar272._8_4_ = ~uVar116 & (uint)fVar146;
  auVar272._12_4_ = ~uVar117 & (uint)fVar147;
  auVar272 = auVar272 | auVar395;
  uVar114 = -(uint)(fVar367 <= ABS(fVar255));
  uVar115 = -(uint)(fVar118 <= ABS(fVar266));
  uVar116 = -(uint)(fVar146 <= ABS(fVar267));
  uVar117 = -(uint)(fVar147 <= ABS(fVar357));
  auVar256._0_4_ = (uint)fVar255 & uVar114;
  auVar256._4_4_ = (uint)fVar266 & uVar115;
  auVar256._8_4_ = (uint)fVar267 & uVar116;
  auVar256._12_4_ = (uint)fVar357 & uVar117;
  auVar396._0_4_ = ~uVar114 & (uint)fVar367;
  auVar396._4_4_ = ~uVar115 & (uint)fVar118;
  auVar396._8_4_ = ~uVar116 & (uint)fVar146;
  auVar396._12_4_ = ~uVar117 & (uint)fVar147;
  auVar396 = auVar396 | auVar256;
  auVar235 = rcpps(_DAT_01f4bd50,auVar191);
  auVar236._0_4_ = auVar235._0_4_;
  auVar192._0_4_ = auVar191._0_4_ * auVar236._0_4_;
  fVar308 = auVar235._4_4_;
  auVar192._4_4_ = auVar191._4_4_ * fVar308;
  fVar310 = auVar235._8_4_;
  auVar192._8_4_ = auVar191._8_4_ * fVar310;
  fVar313 = auVar235._12_4_;
  auVar192._12_4_ = auVar191._12_4_ * fVar313;
  fVar332 = (1.0 - auVar192._0_4_) * auVar236._0_4_ + auVar236._0_4_;
  fVar308 = (1.0 - auVar192._4_4_) * fVar308 + fVar308;
  fVar310 = (1.0 - auVar192._8_4_) * fVar310 + fVar310;
  fVar313 = (1.0 - auVar192._12_4_) * fVar313 + fVar313;
  auVar193 = rcpps(auVar192,auVar272);
  fVar231 = auVar193._0_4_;
  fVar266 = auVar193._4_4_;
  fVar357 = auVar193._8_4_;
  fVar289 = auVar193._12_4_;
  fVar231 = (1.0 - auVar272._0_4_ * fVar231) * fVar231 + fVar231;
  fVar266 = (1.0 - auVar272._4_4_ * fVar266) * fVar266 + fVar266;
  fVar357 = (1.0 - auVar272._8_4_ * fVar357) * fVar357 + fVar357;
  fVar289 = (1.0 - auVar272._12_4_ * fVar289) * fVar289 + fVar289;
  auVar193 = rcpps(auVar193,auVar396);
  fVar255 = auVar193._0_4_;
  fVar267 = auVar193._4_4_;
  fVar269 = auVar193._8_4_;
  fVar294 = auVar193._12_4_;
  uVar12 = *(undefined8 *)(prim + uVar105 * 0x16 + 6);
  fVar255 = (1.0 - auVar396._0_4_ * fVar255) * fVar255 + fVar255;
  fVar267 = (1.0 - auVar396._4_4_ * fVar267) * fVar267 + fVar267;
  fVar269 = (1.0 - auVar396._8_4_ * fVar269) * fVar269 + fVar269;
  fVar294 = (1.0 - auVar396._12_4_ * fVar294) * fVar294 + fVar294;
  uVar106 = *(ulong *)(prim + uVar105 * 0x14 + 6);
  auVar239._0_12_ = auVar235._0_12_;
  auVar239._12_2_ = auVar235._6_2_;
  auVar239._14_2_ = (short)((ulong)uVar220 >> 0x30);
  auVar238._12_4_ = auVar239._12_4_;
  auVar238._0_10_ = auVar235._0_10_;
  auVar238._10_2_ = (short)((ulong)uVar220 >> 0x20);
  auVar237._10_6_ = auVar238._10_6_;
  auVar237._0_8_ = auVar235._0_8_;
  auVar237._8_2_ = auVar235._4_2_;
  auVar236._8_8_ = auVar237._8_8_;
  sVar148 = (short)((ulong)uVar220 >> 0x10);
  auVar236._6_2_ = sVar148;
  auVar236._4_2_ = auVar235._2_2_;
  auVar240._0_4_ = (int)(short)uVar220;
  iVar149 = auVar236._4_4_ >> 0x10;
  auVar234._0_8_ = CONCAT44(iVar149,auVar240._0_4_);
  auVar234._8_4_ = auVar237._8_4_ >> 0x10;
  auVar273._0_4_ = (float)auVar240._0_4_;
  fVar329 = (float)iVar149;
  auVar270._0_8_ = CONCAT44(fVar329,auVar273._0_4_);
  auVar270._8_4_ = (float)auVar234._8_4_;
  auVar243._12_2_ = sVar148 >> 0xf;
  auVar243._0_12_ = auVar234;
  auVar243._14_2_ = (short)((ulong)uVar9 >> 0x30);
  auVar242._12_4_ = auVar243._12_4_;
  auVar242._0_10_ = auVar234._0_10_;
  auVar242._10_2_ = (short)((ulong)uVar9 >> 0x20);
  auVar241._10_6_ = auVar242._10_6_;
  auVar241._8_2_ = sVar148;
  auVar241._0_8_ = auVar234._0_8_;
  auVar240._8_8_ = auVar241._8_8_;
  auVar240._6_2_ = (short)((ulong)uVar9 >> 0x10);
  auVar240._4_2_ = (short)uVar220 >> 0xf;
  uVar220 = *(undefined8 *)(prim + uVar105 * 0x18 + 6);
  auVar276._12_2_ = (short)((uint)fVar329 >> 0x10);
  auVar276._0_12_ = auVar270;
  auVar276._14_2_ = (short)((ulong)uVar10 >> 0x30);
  auVar275._12_4_ = auVar276._12_4_;
  auVar275._0_10_ = auVar270._0_10_;
  auVar275._10_2_ = (short)((ulong)uVar10 >> 0x20);
  auVar274._10_6_ = auVar275._10_6_;
  auVar274._8_2_ = SUB42(fVar329,0);
  auVar274._0_8_ = auVar270._0_8_;
  auVar273._8_8_ = auVar274._8_8_;
  sVar148 = (short)((ulong)uVar10 >> 0x10);
  auVar273._6_2_ = sVar148;
  auVar273._4_2_ = (short)((uint)auVar273._0_4_ >> 0x10);
  auVar277._0_4_ = (int)(short)uVar10;
  iVar149 = auVar273._4_4_ >> 0x10;
  auVar271._0_8_ = CONCAT44(iVar149,auVar277._0_4_);
  auVar271._8_4_ = auVar274._8_4_ >> 0x10;
  auVar317._0_4_ = (float)auVar277._0_4_;
  fVar370 = (float)iVar149;
  auVar316._0_8_ = CONCAT44(fVar370,auVar317._0_4_);
  auVar316._8_4_ = (float)auVar271._8_4_;
  auVar280._12_2_ = sVar148 >> 0xf;
  auVar280._0_12_ = auVar271;
  auVar280._14_2_ = (short)((ulong)uVar11 >> 0x30);
  auVar279._12_4_ = auVar280._12_4_;
  auVar279._0_10_ = auVar271._0_10_;
  auVar279._10_2_ = (short)((ulong)uVar11 >> 0x20);
  auVar278._10_6_ = auVar279._10_6_;
  auVar278._8_2_ = sVar148;
  auVar278._0_8_ = auVar271._0_8_;
  auVar277._8_8_ = auVar278._8_8_;
  auVar277._6_2_ = (short)((ulong)uVar11 >> 0x10);
  auVar277._4_2_ = (short)uVar10 >> 0xf;
  uVar145 = (undefined2)(uVar109 >> 0x30);
  auVar172._8_4_ = 0;
  auVar172._0_8_ = uVar109;
  auVar172._12_2_ = uVar145;
  auVar172._14_2_ = uVar145;
  uVar145 = (undefined2)(uVar109 >> 0x20);
  auVar235._12_4_ = auVar172._12_4_;
  auVar235._8_2_ = 0;
  auVar235._0_8_ = uVar109;
  auVar235._10_2_ = uVar145;
  auVar193._10_6_ = auVar235._10_6_;
  auVar193._8_2_ = uVar145;
  auVar193._0_8_ = uVar109;
  uVar145 = (undefined2)(uVar109 >> 0x10);
  auVar87._4_8_ = auVar193._8_8_;
  auVar87._2_2_ = uVar145;
  auVar87._0_2_ = uVar145;
  auVar120._0_4_ = (float)(int)(short)uVar109;
  fVar367 = (float)(auVar87._0_4_ >> 0x10);
  auVar119._0_8_ = CONCAT44(fVar367,auVar120._0_4_);
  auVar119._8_4_ = (float)(auVar193._8_4_ >> 0x10);
  auVar320._12_2_ = (short)((uint)fVar370 >> 0x10);
  auVar320._0_12_ = auVar316;
  auVar320._14_2_ = (short)((ulong)uVar12 >> 0x30);
  auVar319._12_4_ = auVar320._12_4_;
  auVar319._0_10_ = auVar316._0_10_;
  auVar319._10_2_ = (short)((ulong)uVar12 >> 0x20);
  auVar318._10_6_ = auVar319._10_6_;
  auVar318._8_2_ = SUB42(fVar370,0);
  auVar318._0_8_ = auVar316._0_8_;
  auVar317._8_8_ = auVar318._8_8_;
  auVar317._6_2_ = (short)((ulong)uVar12 >> 0x10);
  auVar317._4_2_ = (short)((uint)auVar317._0_4_ >> 0x10);
  uVar216 = (undefined2)(uVar106 >> 0x30);
  auVar205._12_2_ = (short)((uint)fVar367 >> 0x10);
  auVar205._0_12_ = auVar119;
  auVar205._14_2_ = uVar216;
  auVar323._12_4_ = auVar205._12_4_;
  auVar323._0_10_ = auVar119._0_10_;
  uVar214 = (undefined2)(uVar106 >> 0x20);
  auVar323._10_2_ = uVar214;
  auVar121._10_6_ = auVar323._10_6_;
  auVar121._8_2_ = SUB42(fVar367,0);
  auVar121._0_8_ = auVar119._0_8_;
  auVar120._8_8_ = auVar121._8_8_;
  uVar145 = (undefined2)(uVar106 >> 0x10);
  auVar120._6_2_ = uVar145;
  auVar120._4_2_ = (short)((uint)auVar120._0_4_ >> 0x10);
  fVar118 = (float)(auVar120._4_4_ >> 0x10);
  fVar190 = (float)(auVar121._8_4_ >> 0x10);
  auVar196._8_4_ = 0;
  auVar196._0_8_ = uVar106;
  auVar196._12_2_ = uVar216;
  auVar196._14_2_ = (short)((ulong)uVar220 >> 0x30);
  auVar195._12_4_ = auVar196._12_4_;
  auVar195._8_2_ = 0;
  auVar195._0_8_ = uVar106;
  auVar195._10_2_ = (short)((ulong)uVar220 >> 0x20);
  auVar194._10_6_ = auVar195._10_6_;
  auVar194._8_2_ = uVar214;
  auVar194._0_8_ = uVar106;
  auVar88._4_8_ = auVar194._8_8_;
  auVar88._2_2_ = (short)((ulong)uVar220 >> 0x10);
  auVar88._0_2_ = uVar145;
  uVar109 = *(ulong *)(prim + uVar105 * 0x1d + 6);
  uVar145 = (undefined2)(uVar109 >> 0x30);
  auVar124._8_4_ = 0;
  auVar124._0_8_ = uVar109;
  auVar124._12_2_ = uVar145;
  auVar124._14_2_ = uVar145;
  uVar145 = (undefined2)(uVar109 >> 0x20);
  auVar123._12_4_ = auVar124._12_4_;
  auVar123._8_2_ = 0;
  auVar123._0_8_ = uVar109;
  auVar123._10_2_ = uVar145;
  auVar122._10_6_ = auVar123._10_6_;
  auVar122._8_2_ = uVar145;
  auVar122._0_8_ = uVar109;
  uVar145 = (undefined2)(uVar109 >> 0x10);
  auVar89._4_8_ = auVar122._8_8_;
  auVar89._2_2_ = uVar145;
  auVar89._0_2_ = uVar145;
  fVar146 = (float)(auVar89._0_4_ >> 0x10);
  fVar215 = (float)(auVar122._8_4_ >> 0x10);
  uVar112 = *(ulong *)(prim + uVar105 * 0x21 + 6);
  uVar145 = (undefined2)(uVar112 >> 0x30);
  auVar199._8_4_ = 0;
  auVar199._0_8_ = uVar112;
  auVar199._12_2_ = uVar145;
  auVar199._14_2_ = uVar145;
  uVar145 = (undefined2)(uVar112 >> 0x20);
  auVar198._12_4_ = auVar199._12_4_;
  auVar198._8_2_ = 0;
  auVar198._0_8_ = uVar112;
  auVar198._10_2_ = uVar145;
  auVar197._10_6_ = auVar198._10_6_;
  auVar197._8_2_ = uVar145;
  auVar197._0_8_ = uVar112;
  uVar145 = (undefined2)(uVar112 >> 0x10);
  auVar90._4_8_ = auVar197._8_8_;
  auVar90._2_2_ = uVar145;
  auVar90._0_2_ = uVar145;
  uVar13 = *(ulong *)(prim + uVar105 * 0x1f + 6);
  uVar145 = (undefined2)(uVar13 >> 0x30);
  auVar127._8_4_ = 0;
  auVar127._0_8_ = uVar13;
  auVar127._12_2_ = uVar145;
  auVar127._14_2_ = uVar145;
  uVar145 = (undefined2)(uVar13 >> 0x20);
  auVar126._12_4_ = auVar127._12_4_;
  auVar126._8_2_ = 0;
  auVar126._0_8_ = uVar13;
  auVar126._10_2_ = uVar145;
  auVar125._10_6_ = auVar126._10_6_;
  auVar125._8_2_ = uVar145;
  auVar125._0_8_ = uVar13;
  uVar145 = (undefined2)(uVar13 >> 0x10);
  auVar91._4_8_ = auVar125._8_8_;
  auVar91._2_2_ = uVar145;
  auVar91._0_2_ = uVar145;
  fVar147 = (float)(auVar91._0_4_ >> 0x10);
  fVar217 = (float)(auVar125._8_4_ >> 0x10);
  uVar105 = *(ulong *)(prim + uVar105 * 0x23 + 6);
  uVar145 = (undefined2)(uVar105 >> 0x30);
  auVar202._8_4_ = 0;
  auVar202._0_8_ = uVar105;
  auVar202._12_2_ = uVar145;
  auVar202._14_2_ = uVar145;
  uVar145 = (undefined2)(uVar105 >> 0x20);
  auVar201._12_4_ = auVar202._12_4_;
  auVar201._8_2_ = 0;
  auVar201._0_8_ = uVar105;
  auVar201._10_2_ = uVar145;
  auVar200._10_6_ = auVar201._10_6_;
  auVar200._8_2_ = uVar145;
  auVar200._0_8_ = uVar105;
  uVar145 = (undefined2)(uVar105 >> 0x10);
  auVar92._4_8_ = auVar200._8_8_;
  auVar92._2_2_ = uVar145;
  auVar92._0_2_ = uVar145;
  auVar244._0_8_ =
       CONCAT44(((((float)(auVar240._4_4_ >> 0x10) - fVar329) * fVar189 + fVar329) - fVar345) *
                fVar308,((((float)(int)(short)uVar9 - auVar273._0_4_) * fVar189 + auVar273._0_4_) -
                        fVar365) * fVar332);
  auVar244._8_4_ =
       ((((float)(auVar241._8_4_ >> 0x10) - auVar270._8_4_) * fVar189 + auVar270._8_4_) - fVar232) *
       fVar310;
  auVar244._12_4_ =
       ((((float)(auVar242._12_4_ >> 0x10) - (float)(auVar238._12_4_ >> 0x10)) * fVar189 +
        (float)(auVar238._12_4_ >> 0x10)) - fVar233) * fVar313;
  auVar281._0_4_ =
       ((((float)(int)(short)uVar11 - auVar317._0_4_) * fVar189 + auVar317._0_4_) - fVar365) *
       fVar332;
  auVar281._4_4_ =
       ((((float)(auVar277._4_4_ >> 0x10) - fVar370) * fVar189 + fVar370) - fVar345) * fVar308;
  auVar281._8_4_ =
       ((((float)(auVar278._8_4_ >> 0x10) - auVar316._8_4_) * fVar189 + auVar316._8_4_) - fVar232) *
       fVar310;
  auVar281._12_4_ =
       ((((float)(auVar279._12_4_ >> 0x10) - (float)(auVar275._12_4_ >> 0x10)) * fVar189 +
        (float)(auVar275._12_4_ >> 0x10)) - fVar233) * fVar313;
  auVar321._0_8_ =
       CONCAT44(((((float)(auVar317._4_4_ >> 0x10) - fVar367) * fVar189 + fVar367) - fVar391) *
                fVar266,((((float)(int)(short)uVar12 - auVar120._0_4_) * fVar189 + auVar120._0_4_) -
                        fVar384) * fVar231);
  auVar321._8_4_ =
       ((((float)(auVar318._8_4_ >> 0x10) - auVar119._8_4_) * fVar189 + auVar119._8_4_) - fVar392) *
       fVar357;
  auVar321._12_4_ =
       ((((float)(auVar319._12_4_ >> 0x10) - (float)(auVar235._12_4_ >> 0x10)) * fVar189 +
        (float)(auVar235._12_4_ >> 0x10)) - fVar393) * fVar289;
  auVar339._0_4_ =
       ((((float)(int)(short)uVar220 - (float)(int)(short)uVar106) * fVar189 +
        (float)(int)(short)uVar106) - fVar384) * fVar231;
  auVar339._4_4_ =
       ((((float)(auVar88._0_4_ >> 0x10) - fVar118) * fVar189 + fVar118) - fVar391) * fVar266;
  auVar339._8_4_ =
       ((((float)(auVar194._8_4_ >> 0x10) - fVar190) * fVar189 + fVar190) - fVar392) * fVar357;
  auVar339._12_4_ =
       ((((float)(auVar195._12_4_ >> 0x10) - (float)(auVar323._12_4_ >> 0x10)) * fVar189 +
        (float)(auVar323._12_4_ >> 0x10)) - fVar393) * fVar289;
  auVar359._0_8_ =
       CONCAT44(((((float)(auVar90._0_4_ >> 0x10) - fVar146) * fVar189 + fVar146) - fVar219) *
                fVar267,((((float)(int)(short)uVar112 - (float)(int)(short)uVar109) * fVar189 +
                         (float)(int)(short)uVar109) - fVar218) * fVar255);
  auVar359._8_4_ =
       ((((float)(auVar197._8_4_ >> 0x10) - fVar215) * fVar189 + fVar215) - fVar229) * fVar269;
  auVar359._12_4_ =
       ((((float)(auVar198._12_4_ >> 0x10) - (float)(auVar123._12_4_ >> 0x10)) * fVar189 +
        (float)(auVar123._12_4_ >> 0x10)) - fVar230) * fVar294;
  auVar375._0_4_ =
       ((((float)(int)(short)uVar105 - (float)(int)(short)uVar13) * fVar189 +
        (float)(int)(short)uVar13) - fVar218) * fVar255;
  auVar375._4_4_ =
       ((((float)(auVar92._0_4_ >> 0x10) - fVar147) * fVar189 + fVar147) - fVar219) * fVar267;
  auVar375._8_4_ =
       ((((float)(auVar200._8_4_ >> 0x10) - fVar217) * fVar189 + fVar217) - fVar229) * fVar269;
  auVar375._12_4_ =
       ((((float)(auVar201._12_4_ >> 0x10) - (float)(auVar126._12_4_ >> 0x10)) * fVar189 +
        (float)(auVar126._12_4_ >> 0x10)) - fVar230) * fVar294;
  auVar203._8_4_ = auVar244._8_4_;
  auVar203._0_8_ = auVar244._0_8_;
  auVar203._12_4_ = auVar244._12_4_;
  auVar235 = minps(auVar203,auVar281);
  auVar128._8_4_ = auVar321._8_4_;
  auVar128._0_8_ = auVar321._0_8_;
  auVar128._12_4_ = auVar321._12_4_;
  auVar193 = minps(auVar128,auVar339);
  auVar235 = maxps(auVar235,auVar193);
  auVar129._8_4_ = auVar359._8_4_;
  auVar129._0_8_ = auVar359._0_8_;
  auVar129._12_4_ = auVar359._12_4_;
  auVar193 = minps(auVar129,auVar375);
  uVar108 = *(undefined4 *)((long)&(ray->super_RayK<1>).org.field_0 + 0xc);
  auVar168._4_4_ = uVar108;
  auVar168._0_4_ = uVar108;
  auVar168._8_4_ = uVar108;
  auVar168._12_4_ = uVar108;
  auVar193 = maxps(auVar193,auVar168);
  auVar193 = maxps(auVar235,auVar193);
  local_1c8 = auVar193._0_4_ * 0.99999964;
  fStack_1c4 = auVar193._4_4_ * 0.99999964;
  fStack_1c0 = auVar193._8_4_ * 0.99999964;
  fStack_1bc = auVar193._12_4_ * 0.99999964;
  auVar193 = maxps(auVar244,auVar281);
  auVar235 = maxps(auVar321,auVar339);
  auVar193 = minps(auVar193,auVar235);
  auVar235 = maxps(auVar359,auVar375);
  fVar367 = (ray->super_RayK<1>).tfar;
  auVar130._4_4_ = fVar367;
  auVar130._0_4_ = fVar367;
  auVar130._8_4_ = fVar367;
  auVar130._12_4_ = fVar367;
  auVar235 = minps(auVar235,auVar130);
  auVar193 = minps(auVar193,auVar235);
  auVar169._0_4_ = -(uint)(PVar14 != (Primitive)0x0 && local_1c8 <= auVar193._0_4_ * 1.0000004);
  auVar169._4_4_ = -(uint)(1 < (byte)PVar14 && fStack_1c4 <= auVar193._4_4_ * 1.0000004);
  auVar169._8_4_ = -(uint)(2 < (byte)PVar14 && fStack_1c0 <= auVar193._8_4_ * 1.0000004);
  auVar169._12_4_ = -(uint)(3 < (byte)PVar14 && fStack_1bc <= auVar193._12_4_ * 1.0000004);
  uVar108 = movmskps((int)unaff_RBP,auVar169);
  uVar109 = CONCAT44((int)((ulong)unaff_RBP >> 0x20),uVar108);
  local_178._0_4_ = -(uint)((int)mm_lookupmask_ps._240_4_ < 0);
  local_178._4_4_ = -(uint)((int)mm_lookupmask_ps._244_4_ < 0);
  local_178._8_4_ = -(uint)((int)mm_lookupmask_ps._248_4_ < 0);
  local_178._12_4_ = 0;
  local_290 = prim;
LAB_0036aaab:
  if (uVar109 == 0) {
    return;
  }
  lVar111 = 0;
  if (uVar109 != 0) {
    for (; (uVar109 >> lVar111 & 1) == 0; lVar111 = lVar111 + 1) {
    }
  }
  uVar114 = *(uint *)(local_290 + lVar111 * 4 + 6);
  pGVar23 = (context->scene->geometries).items[*(uint *)(local_290 + 2)].ptr;
  fVar367 = pGVar23->fnumTimeSegments;
  fVar118 = (pGVar23->time_range).lower;
  fVar146 = (((ray->super_RayK<1>).dir.field_0.m128[3] - fVar118) /
            ((pGVar23->time_range).upper - fVar118)) * fVar367;
  fVar118 = floorf(fVar146);
  fVar367 = fVar367 + -1.0;
  if (fVar367 <= fVar118) {
    fVar118 = fVar367;
  }
  fVar367 = 0.0;
  if (0.0 <= fVar118) {
    fVar367 = fVar118;
  }
  fVar146 = fVar146 - fVar367;
  local_350 = (ulong)uVar114;
  uVar106 = (ulong)*(uint *)(*(long *)&pGVar23->field_0x58 +
                            (ulong)uVar114 *
                            pGVar23[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                            _M_i);
  _Var24 = pGVar23[4].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
  lVar110 = (long)(int)fVar367 * 0x38;
  lVar25 = *(long *)(_Var24 + lVar110);
  lVar26 = *(long *)(_Var24 + 0x10 + lVar110);
  pfVar3 = (float *)(lVar25 + lVar26 * uVar106);
  fVar367 = *pfVar3;
  fVar118 = pfVar3[1];
  fVar147 = pfVar3[2];
  fVar190 = pfVar3[3];
  lVar111 = uVar106 + 1;
  pfVar3 = (float *)(lVar25 + lVar26 * lVar111);
  lVar1 = uVar106 + 2;
  pfVar4 = (float *)(lVar25 + lVar26 * lVar1);
  lVar2 = uVar106 + 3;
  pfVar5 = (float *)(lVar25 + lVar26 * lVar2);
  fVar215 = *pfVar5;
  fVar217 = pfVar5[1];
  fVar218 = pfVar5[2];
  fVar219 = pfVar5[3];
  lVar25 = *(long *)&pGVar23[4].fnumTimeSegments;
  lVar26 = *(long *)(lVar25 + lVar110);
  lVar27 = *(long *)(lVar25 + 0x10 + lVar110);
  pfVar5 = (float *)(lVar26 + lVar27 * uVar106);
  fVar229 = *pfVar5;
  fVar230 = pfVar5[1];
  fVar189 = pfVar5[2];
  fVar231 = pfVar5[3];
  pfVar5 = (float *)(lVar26 + lVar27 * lVar111);
  pfVar6 = (float *)(lVar26 + lVar27 * lVar1);
  pfVar7 = (float *)(lVar26 + lVar27 * lVar2);
  fVar255 = *pfVar7;
  fVar266 = pfVar7[1];
  fVar267 = pfVar7[2];
  fVar357 = pfVar7[3];
  fVar289 = *pfVar4 * 0.0;
  fVar365 = pfVar4[1] * 0.0;
  fVar232 = pfVar4[2] * 0.0;
  fVar308 = pfVar4[3] * 0.0;
  fVar269 = fVar215 * 0.0 + fVar289;
  fVar294 = fVar217 * 0.0 + fVar365;
  fVar345 = fVar218 * 0.0 + fVar232;
  fVar233 = fVar219 * 0.0 + fVar308;
  fVar409 = *pfVar3 * 0.0;
  fVar411 = pfVar3[1] * 0.0;
  fVar349 = pfVar3[2] * 0.0;
  fVar353 = pfVar3[3] * 0.0;
  fVar391 = fVar409 + fVar269 + fVar367;
  fVar392 = fVar411 + fVar294 + fVar118;
  fVar393 = fVar349 + fVar345 + fVar147;
  fVar394 = fVar353 + fVar233 + fVar190;
  fVar269 = (*pfVar3 * 3.0 + fVar269) - fVar367 * 3.0;
  fVar294 = (pfVar3[1] * 3.0 + fVar294) - fVar118 * 3.0;
  fVar345 = (pfVar3[2] * 3.0 + fVar345) - fVar147 * 3.0;
  fVar233 = (pfVar3[3] * 3.0 + fVar233) - fVar190 * 3.0;
  fVar410 = *pfVar6 * 0.0;
  fVar346 = pfVar6[1] * 0.0;
  fVar350 = pfVar6[2] * 0.0;
  fVar354 = pfVar6[3] * 0.0;
  fVar310 = fVar255 * 0.0 + fVar410;
  fVar313 = fVar266 * 0.0 + fVar346;
  fVar329 = fVar267 * 0.0 + fVar350;
  fVar332 = fVar357 * 0.0 + fVar354;
  fVar358 = *pfVar5 * 0.0;
  fVar366 = pfVar5[1] * 0.0;
  fVar368 = pfVar5[2] * 0.0;
  fVar369 = pfVar5[3] * 0.0;
  fVar371 = fVar358 + fVar310 + fVar229;
  fVar380 = fVar366 + fVar313 + fVar230;
  fVar382 = fVar368 + fVar329 + fVar189;
  fVar383 = fVar369 + fVar332 + fVar231;
  fVar400 = (*pfVar5 * 3.0 + fVar310) - fVar229 * 3.0;
  fVar401 = (pfVar5[1] * 3.0 + fVar313) - fVar230 * 3.0;
  fVar402 = (pfVar5[2] * 3.0 + fVar329) - fVar189 * 3.0;
  fVar403 = (pfVar5[3] * 3.0 + fVar332) - fVar231 * 3.0;
  fVar370 = fVar289 + fVar215 + fVar409 + fVar367 * 0.0;
  fVar379 = fVar365 + fVar217 + fVar411 + fVar118 * 0.0;
  fVar381 = fVar232 + fVar218 + fVar349 + fVar147 * 0.0;
  fVar384 = fVar308 + fVar219 + fVar353 + fVar190 * 0.0;
  fVar310 = ((fVar215 * 3.0 - *pfVar4 * 3.0) + fVar409) - fVar367 * 0.0;
  fVar313 = ((fVar217 * 3.0 - pfVar4[1] * 3.0) + fVar411) - fVar118 * 0.0;
  fVar329 = ((fVar218 * 3.0 - pfVar4[2] * 3.0) + fVar349) - fVar147 * 0.0;
  fVar332 = ((fVar219 * 3.0 - pfVar4[3] * 3.0) + fVar353) - fVar190 * 0.0;
  fVar215 = fVar410 + fVar255 + fVar358 + fVar229 * 0.0;
  fVar217 = fVar346 + fVar266 + fVar366 + fVar230 * 0.0;
  fVar218 = fVar350 + fVar267 + fVar368 + fVar189 * 0.0;
  fVar289 = fVar354 + fVar357 + fVar369 + fVar231 * 0.0;
  fVar367 = ((fVar255 * 3.0 - *pfVar6 * 3.0) + fVar358) - fVar229 * 0.0;
  fVar118 = ((fVar266 * 3.0 - pfVar6[1] * 3.0) + fVar366) - fVar230 * 0.0;
  fVar147 = ((fVar267 * 3.0 - pfVar6[2] * 3.0) + fVar368) - fVar189 * 0.0;
  fVar190 = ((fVar357 * 3.0 - pfVar6[3] * 3.0) + fVar369) - fVar231 * 0.0;
  fVar365 = fVar294 * fVar371 - fVar380 * fVar269;
  fVar308 = fVar345 * fVar380 - fVar382 * fVar294;
  fVar409 = fVar269 * fVar382 - fVar371 * fVar345;
  fVar410 = fVar233 * fVar383 - fVar383 * fVar233;
  fVar255 = fVar294 * fVar400 - fVar401 * fVar269;
  fVar267 = fVar345 * fVar401 - fVar402 * fVar294;
  fVar357 = fVar269 * fVar402 - fVar400 * fVar345;
  fVar219 = fVar313 * fVar215 - fVar217 * fVar310;
  fVar230 = fVar329 * fVar217 - fVar218 * fVar313;
  fVar189 = fVar310 * fVar218 - fVar215 * fVar329;
  fVar231 = fVar332 * fVar289 - fVar289 * fVar332;
  fVar215 = fVar313 * fVar367 - fVar118 * fVar310;
  fVar217 = fVar329 * fVar118 - fVar147 * fVar313;
  fVar147 = fVar310 * fVar147 - fVar367 * fVar329;
  fVar289 = fVar409 * fVar409 + fVar308 * fVar308 + fVar365 * fVar365;
  auVar235 = ZEXT416((uint)fVar289);
  auVar193 = rsqrtss(ZEXT416((uint)fVar289),auVar235);
  fVar367 = auVar193._0_4_;
  fVar232 = fVar367 * 1.5 - fVar367 * fVar367 * fVar289 * 0.5 * fVar367;
  fVar400 = fVar365 * fVar255 + fVar409 * fVar357 + fVar308 * fVar267;
  fVar367 = fVar410 * fVar232;
  auVar193 = rcpss(auVar235,auVar235);
  fVar266 = (2.0 - fVar289 * auVar193._0_4_) * auVar193._0_4_;
  fVar401 = fVar189 * fVar189 + fVar230 * fVar230 + fVar219 * fVar219;
  auVar193 = ZEXT416((uint)fVar401);
  auVar235 = rsqrtss(ZEXT416((uint)fVar401),auVar193);
  fVar118 = auVar235._0_4_;
  fVar229 = fVar118 * 1.5 - fVar118 * fVar118 * fVar401 * 0.5 * fVar118;
  fVar402 = fVar219 * fVar215 + fVar189 * fVar147 + fVar230 * fVar217;
  fVar218 = fVar231 * fVar229;
  auVar193 = rcpss(auVar193,auVar193);
  fVar118 = (2.0 - fVar401 * auVar193._0_4_) * auVar193._0_4_;
  fVar371 = fVar394 * fVar308 * fVar232;
  fVar383 = fVar394 * fVar409 * fVar232;
  fVar290 = fVar394 * fVar365 * fVar232;
  fVar292 = fVar394 * fVar367;
  fVar337 = fVar391 - fVar371;
  fVar347 = fVar392 - fVar383;
  fVar351 = fVar393 - fVar290;
  fVar355 = fVar394 - fVar292;
  fVar314 = fVar394 * fVar266 * (fVar289 * fVar267 - fVar400 * fVar308) * fVar232 +
            fVar233 * fVar308 * fVar232;
  fVar330 = fVar394 * fVar266 * (fVar289 * fVar357 - fVar400 * fVar409) * fVar232 +
            fVar233 * fVar409 * fVar232;
  fVar333 = fVar394 * fVar266 * (fVar289 * fVar255 - fVar400 * fVar365) * fVar232 +
            fVar233 * fVar365 * fVar232;
  fVar335 = fVar394 * fVar266 * (fVar289 * (fVar233 * fVar403 - fVar403 * fVar233) -
                                fVar400 * fVar410) * fVar232 + fVar233 * fVar367;
  fVar371 = fVar371 + fVar391;
  fVar383 = fVar383 + fVar392;
  fVar290 = fVar290 + fVar393;
  fVar292 = fVar292 + fVar394;
  fVar289 = fVar384 * fVar230 * fVar229;
  fVar365 = fVar384 * fVar189 * fVar229;
  fVar232 = fVar384 * fVar219 * fVar229;
  fVar308 = fVar384 * fVar218;
  fVar409 = fVar370 - fVar289;
  fVar346 = fVar379 - fVar365;
  fVar353 = fVar381 - fVar232;
  fVar366 = fVar384 - fVar308;
  fVar391 = fVar384 * fVar118 * (fVar401 * fVar217 - fVar402 * fVar230) * fVar229 +
            fVar332 * fVar230 * fVar229;
  fVar393 = fVar384 * fVar118 * (fVar401 * fVar147 - fVar402 * fVar189) * fVar229 +
            fVar332 * fVar189 * fVar229;
  fVar400 = fVar384 * fVar118 * (fVar401 * fVar215 - fVar402 * fVar219) * fVar229 +
            fVar332 * fVar219 * fVar229;
  fVar402 = fVar384 * fVar118 * (fVar401 * (fVar332 * fVar190 - fVar190 * fVar332) -
                                fVar402 * fVar231) * fVar229 + fVar332 * fVar218;
  fVar289 = fVar289 + fVar370;
  fVar365 = fVar365 + fVar379;
  fVar232 = fVar232 + fVar381;
  fVar308 = fVar308 + fVar384;
  lVar26 = *(long *)(_Var24 + 0x38 + lVar110);
  lVar27 = *(long *)(_Var24 + 0x48 + lVar110);
  pfVar3 = (float *)(lVar26 + lVar27 * uVar106);
  fVar367 = *pfVar3;
  fVar118 = pfVar3[1];
  fVar147 = pfVar3[2];
  fVar190 = pfVar3[3];
  pfVar3 = (float *)(lVar26 + lVar27 * lVar111);
  pfVar4 = (float *)(lVar26 + lVar27 * lVar1);
  pfVar5 = (float *)(lVar26 + lVar27 * lVar2);
  fVar215 = *pfVar5;
  fVar217 = pfVar5[1];
  fVar218 = pfVar5[2];
  fVar219 = pfVar5[3];
  lVar26 = *(long *)(lVar25 + 0x38 + lVar110);
  lVar25 = *(long *)(lVar25 + 0x48 + lVar110);
  uVar106 = uVar106 * lVar25;
  pfVar5 = (float *)(lVar26 + lVar25 * lVar2);
  fVar229 = *pfVar5;
  fVar230 = pfVar5[1];
  fVar189 = pfVar5[2];
  fVar231 = pfVar5[3];
  fVar392 = *pfVar4 * 0.0;
  fVar394 = pfVar4[1] * 0.0;
  fVar401 = pfVar4[2] * 0.0;
  fVar403 = pfVar4[3] * 0.0;
  fVar411 = fVar215 * 0.0 + fVar392;
  fVar350 = fVar217 * 0.0 + fVar394;
  fVar358 = fVar218 * 0.0 + fVar401;
  fVar369 = fVar219 * 0.0 + fVar403;
  fVar410 = *pfVar3 * 0.0;
  fVar349 = pfVar3[1] * 0.0;
  fVar354 = pfVar3[2] * 0.0;
  fVar368 = pfVar3[3] * 0.0;
  fVar370 = (*pfVar3 * 3.0 + fVar411) - fVar367 * 3.0;
  fVar379 = (pfVar3[1] * 3.0 + fVar350) - fVar118 * 3.0;
  fVar381 = (pfVar3[2] * 3.0 + fVar358) - fVar147 * 3.0;
  fVar384 = (pfVar3[3] * 3.0 + fVar369) - fVar190 * 3.0;
  pfVar3 = (float *)(lVar26 + lVar1 * lVar25);
  fVar315 = *pfVar3 * 0.0;
  fVar331 = pfVar3[1] * 0.0;
  fVar334 = pfVar3[2] * 0.0;
  fVar336 = pfVar3[3] * 0.0;
  fVar295 = fVar229 * 0.0 + fVar315;
  fVar309 = fVar230 * 0.0 + fVar331;
  fVar311 = fVar189 * 0.0 + fVar334;
  fVar312 = fVar231 * 0.0 + fVar336;
  pfVar5 = (float *)(lVar26 + lVar111 * lVar25);
  fVar338 = *pfVar5 * 0.0;
  fVar348 = pfVar5[1] * 0.0;
  fVar352 = pfVar5[2] * 0.0;
  fVar356 = pfVar5[3] * 0.0;
  pfVar6 = (float *)(lVar26 + uVar106);
  fVar255 = *pfVar6;
  fVar266 = pfVar6[1];
  fVar267 = pfVar6[2];
  fVar357 = pfVar6[3];
  fVar380 = (*pfVar5 * 3.0 + fVar295) - fVar255 * 3.0;
  fVar382 = (pfVar5[1] * 3.0 + fVar309) - fVar266 * 3.0;
  fVar291 = (pfVar5[2] * 3.0 + fVar311) - fVar267 * 3.0;
  fVar293 = (pfVar5[3] * 3.0 + fVar312) - fVar357 * 3.0;
  fVar411 = fVar410 + fVar411 + fVar367;
  fVar350 = fVar349 + fVar350 + fVar118;
  fVar358 = fVar354 + fVar358 + fVar147;
  fVar369 = fVar368 + fVar369 + fVar190;
  fVar392 = fVar392 + fVar215 + fVar410 + fVar367 * 0.0;
  fVar394 = fVar394 + fVar217 + fVar349 + fVar118 * 0.0;
  fVar401 = fVar401 + fVar218 + fVar354 + fVar147 * 0.0;
  fVar403 = fVar403 + fVar219 + fVar368 + fVar190 * 0.0;
  fVar367 = ((fVar215 * 3.0 - *pfVar4 * 3.0) + fVar410) - fVar367 * 0.0;
  fVar118 = ((fVar217 * 3.0 - pfVar4[1] * 3.0) + fVar349) - fVar118 * 0.0;
  fVar147 = ((fVar218 * 3.0 - pfVar4[2] * 3.0) + fVar354) - fVar147 * 0.0;
  fVar190 = ((fVar219 * 3.0 - pfVar4[3] * 3.0) + fVar368) - fVar190 * 0.0;
  fVar219 = fVar338 + fVar295 + fVar255;
  fVar295 = fVar348 + fVar309 + fVar266;
  fVar309 = fVar352 + fVar311 + fVar267;
  fVar311 = fVar356 + fVar312 + fVar357;
  fVar410 = fVar315 + fVar229 + fVar338 + fVar255 * 0.0;
  fVar349 = fVar331 + fVar230 + fVar348 + fVar266 * 0.0;
  fVar354 = fVar334 + fVar189 + fVar352 + fVar267 * 0.0;
  fVar368 = fVar336 + fVar231 + fVar356 + fVar357 * 0.0;
  fVar215 = ((fVar229 * 3.0 - *pfVar3 * 3.0) + fVar338) - fVar255 * 0.0;
  fVar217 = ((fVar230 * 3.0 - pfVar3[1] * 3.0) + fVar348) - fVar266 * 0.0;
  fVar218 = ((fVar189 * 3.0 - pfVar3[2] * 3.0) + fVar352) - fVar267 * 0.0;
  fVar231 = ((fVar231 * 3.0 - pfVar3[3] * 3.0) + fVar356) - fVar357 * 0.0;
  fVar189 = fVar379 * fVar219 - fVar295 * fVar370;
  fVar255 = fVar381 * fVar295 - fVar309 * fVar379;
  fVar309 = fVar370 * fVar309 - fVar219 * fVar381;
  fVar312 = fVar384 * fVar311 - fVar311 * fVar384;
  fVar219 = fVar379 * fVar380 - fVar382 * fVar370;
  fVar229 = fVar381 * fVar382 - fVar291 * fVar379;
  fVar230 = fVar370 * fVar291 - fVar380 * fVar381;
  fVar380 = fVar118 * fVar410 - fVar349 * fVar367;
  fVar291 = fVar147 * fVar349 - fVar354 * fVar118;
  fVar295 = fVar367 * fVar354 - fVar410 * fVar147;
  fVar311 = fVar190 * fVar368 - fVar368 * fVar190;
  fVar266 = fVar118 * fVar215 - fVar217 * fVar367;
  fVar357 = fVar147 * fVar217 - fVar218 * fVar118;
  fVar349 = fVar367 * fVar218 - fVar215 * fVar147;
  fVar215 = fVar309 * fVar309 + fVar255 * fVar255 + fVar189 * fVar189;
  auVar193 = ZEXT416((uint)fVar215);
  auVar235 = rsqrtss(ZEXT416((uint)fVar215),auVar193);
  fVar217 = auVar235._0_4_;
  fVar382 = fVar217 * 1.5 - fVar217 * fVar217 * fVar215 * 0.5 * fVar217;
  fVar336 = fVar189 * fVar219 + fVar309 * fVar230 + fVar255 * fVar229;
  auVar193 = rcpss(auVar193,auVar193);
  fVar217 = (2.0 - fVar215 * auVar193._0_4_) * auVar193._0_4_;
  fVar218 = fVar312 * fVar382;
  fVar315 = fVar295 * fVar295 + fVar291 * fVar291 + fVar380 * fVar380;
  auVar193 = ZEXT416((uint)fVar315);
  auVar235 = rsqrtss(ZEXT416((uint)fVar315),auVar193);
  fVar267 = auVar235._0_4_;
  fVar334 = fVar267 * 1.5 - fVar267 * fVar267 * fVar315 * 0.5 * fVar267;
  fVar338 = fVar380 * fVar266 + fVar295 * fVar349 + fVar291 * fVar357;
  auVar193 = rcpss(auVar193,auVar193);
  fVar348 = (2.0 - fVar315 * auVar193._0_4_) * auVar193._0_4_;
  fVar331 = fVar311 * fVar334;
  fVar267 = fVar369 * fVar255 * fVar382;
  fVar410 = fVar369 * fVar309 * fVar382;
  fVar354 = fVar369 * fVar189 * fVar382;
  fVar368 = fVar369 * fVar218;
  fVar229 = fVar369 * fVar217 * (fVar215 * fVar229 - fVar336 * fVar255) * fVar382 +
            fVar384 * fVar255 * fVar382;
  fVar230 = fVar369 * fVar217 * (fVar215 * fVar230 - fVar336 * fVar309) * fVar382 +
            fVar384 * fVar309 * fVar382;
  fVar189 = fVar369 * fVar217 * (fVar215 * fVar219 - fVar336 * fVar189) * fVar382 +
            fVar384 * fVar189 * fVar382;
  fVar255 = fVar369 * fVar217 * (fVar215 * (fVar384 * fVar293 - fVar293 * fVar384) -
                                fVar336 * fVar312) * fVar382 + fVar384 * fVar218;
  fVar382 = fVar411 - fVar267;
  fVar293 = fVar350 - fVar410;
  fVar309 = fVar358 - fVar354;
  fVar312 = fVar369 - fVar368;
  fVar267 = fVar267 + fVar411;
  fVar410 = fVar410 + fVar350;
  fVar354 = fVar354 + fVar358;
  fVar368 = fVar368 + fVar369;
  fVar215 = fVar403 * fVar291 * fVar334;
  fVar217 = fVar403 * fVar295 * fVar334;
  fVar218 = fVar403 * fVar380 * fVar334;
  fVar219 = fVar403 * fVar331;
  fVar350 = fVar403 * fVar348 * (fVar315 * fVar357 - fVar338 * fVar291) * fVar334 +
            fVar190 * fVar291 * fVar334;
  fVar349 = fVar403 * fVar348 * (fVar315 * fVar349 - fVar338 * fVar295) * fVar334 +
            fVar190 * fVar295 * fVar334;
  fVar358 = fVar403 * fVar348 * (fVar315 * fVar266 - fVar338 * fVar380) * fVar334 +
            fVar190 * fVar380 * fVar334;
  fVar369 = fVar403 * fVar348 * (fVar315 * (fVar190 * fVar231 - fVar231 * fVar190) -
                                fVar338 * fVar311) * fVar334 + fVar190 * fVar331;
  fVar231 = fVar392 - fVar215;
  fVar266 = fVar394 - fVar217;
  fVar357 = fVar401 - fVar218;
  fVar411 = fVar403 - fVar219;
  fVar215 = fVar215 + fVar392;
  fVar217 = fVar217 + fVar394;
  fVar218 = fVar218 + fVar401;
  fVar219 = fVar219 + fVar403;
  fVar392 = 1.0 - fVar146;
  local_398 = fVar337 * fVar392 + fVar382 * fVar146;
  fStack_394 = fVar347 * fVar392 + fVar293 * fVar146;
  fStack_390 = fVar351 * fVar392 + fVar309 * fVar146;
  fStack_38c = fVar355 * fVar392 + fVar312 * fVar146;
  local_3a8 = ((fVar269 - fVar314) * 0.33333334 + fVar337) * fVar392 +
              ((fVar370 - fVar229) * 0.33333334 + fVar382) * fVar146;
  fStack_3a4 = ((fVar294 - fVar330) * 0.33333334 + fVar347) * fVar392 +
               ((fVar379 - fVar230) * 0.33333334 + fVar293) * fVar146;
  fStack_3a0 = ((fVar345 - fVar333) * 0.33333334 + fVar351) * fVar392 +
               ((fVar381 - fVar189) * 0.33333334 + fVar309) * fVar146;
  fStack_39c = ((fVar233 - fVar335) * 0.33333334 + fVar355) * fVar392 +
               ((fVar384 - fVar255) * 0.33333334 + fVar312) * fVar146;
  local_3c8 = (fVar409 - (fVar310 - fVar391) * 0.33333334) * fVar392 +
              (fVar231 - (fVar367 - fVar350) * 0.33333334) * fVar146;
  fStack_3c4 = (fVar346 - (fVar313 - fVar393) * 0.33333334) * fVar392 +
               (fVar266 - (fVar118 - fVar349) * 0.33333334) * fVar146;
  fStack_3c0 = (fVar353 - (fVar329 - fVar400) * 0.33333334) * fVar392 +
               (fVar357 - (fVar147 - fVar358) * 0.33333334) * fVar146;
  fStack_3bc = (fVar366 - (fVar332 - fVar402) * 0.33333334) * fVar392 +
               (fVar411 - (fVar190 - fVar369) * 0.33333334) * fVar146;
  local_3b8 = fVar409 * fVar392 + fVar231 * fVar146;
  fStack_3b4 = fVar346 * fVar392 + fVar266 * fVar146;
  fStack_3b0 = fVar353 * fVar392 + fVar357 * fVar146;
  fStack_3ac = fVar366 * fVar392 + fVar411 * fVar146;
  local_388 = fVar371 * fVar392 + fVar267 * fVar146;
  fStack_384 = fVar383 * fVar392 + fVar410 * fVar146;
  fStack_380 = fVar290 * fVar392 + fVar354 * fVar146;
  fStack_37c = fVar292 * fVar392 + fVar368 * fVar146;
  local_378 = ((fVar314 + fVar269) * 0.33333334 + fVar371) * fVar392 +
              ((fVar229 + fVar370) * 0.33333334 + fVar267) * fVar146;
  fStack_374 = ((fVar330 + fVar294) * 0.33333334 + fVar383) * fVar392 +
               ((fVar230 + fVar379) * 0.33333334 + fVar410) * fVar146;
  fStack_370 = ((fVar333 + fVar345) * 0.33333334 + fVar290) * fVar392 +
               ((fVar189 + fVar381) * 0.33333334 + fVar354) * fVar146;
  fStack_36c = ((fVar335 + fVar233) * 0.33333334 + fVar292) * fVar392 +
               ((fVar255 + fVar384) * 0.33333334 + fVar368) * fVar146;
  local_3dc.m128[1] =
       (fVar289 - (fVar391 + fVar310) * 0.33333334) * fVar392 +
       (fVar215 - (fVar350 + fVar367) * 0.33333334) * fVar146;
  local_3dc.m128[2] =
       (fVar365 - (fVar393 + fVar313) * 0.33333334) * fVar392 +
       (fVar217 - (fVar349 + fVar118) * 0.33333334) * fVar146;
  local_3dc.m128[3] =
       (fVar232 - (fVar400 + fVar329) * 0.33333334) * fVar392 +
       (fVar218 - (fVar358 + fVar147) * 0.33333334) * fVar146;
  fStack_3cc = (fVar308 - (fVar402 + fVar332) * 0.33333334) * fVar392 +
               (fVar219 - (fVar369 + fVar190) * 0.33333334) * fVar146;
  local_218 = fVar392 * fVar289 + fVar146 * fVar215;
  fStack_214 = fVar392 * fVar365 + fVar146 * fVar217;
  fStack_210 = fVar392 * fVar232 + fVar146 * fVar218;
  fStack_20c = fVar392 * fVar308 + fVar146 * fVar219;
  fVar367 = (ray->super_RayK<1>).org.field_0.m128[0];
  fVar118 = (ray->super_RayK<1>).org.field_0.m128[1];
  fVar146 = (ray->super_RayK<1>).org.field_0.m128[2];
  fVar147 = (pre->ray_space).vx.field_0.m128[0];
  fVar190 = (pre->ray_space).vx.field_0.m128[1];
  fVar215 = (pre->ray_space).vy.field_0.m128[0];
  fVar217 = (pre->ray_space).vy.field_0.m128[1];
  fVar218 = (pre->ray_space).vz.field_0.m128[0];
  fVar219 = (pre->ray_space).vz.field_0.m128[1];
  fVar255 = (local_398 - fVar367) * fVar147 +
            (fStack_394 - fVar118) * fVar215 + (fStack_390 - fVar146) * fVar218;
  fVar266 = (local_398 - fVar367) * fVar190 +
            (fStack_394 - fVar118) * fVar217 + (fStack_390 - fVar146) * fVar219;
  local_2d8._0_8_ = CONCAT44(fVar266,fVar255);
  fVar189 = (local_3a8 - fVar367) * fVar147 +
            (fStack_3a4 - fVar118) * fVar215 + (fStack_3a0 - fVar146) * fVar218;
  fVar231 = (local_3a8 - fVar367) * fVar190 +
            (fStack_3a4 - fVar118) * fVar217 + (fStack_3a0 - fVar146) * fVar219;
  local_2e8._0_8_ = CONCAT44(fVar231,fVar189);
  fVar229 = (local_3c8 - fVar367) * fVar147 +
            (fStack_3c4 - fVar118) * fVar215 + (fStack_3c0 - fVar146) * fVar218;
  fVar230 = (local_3c8 - fVar367) * fVar190 +
            (fStack_3c4 - fVar118) * fVar217 + (fStack_3c0 - fVar146) * fVar219;
  local_348 = CONCAT44(fVar230,fVar229);
  fVar269 = (local_3b8 - fVar367) * fVar147 +
            (fStack_3b4 - fVar118) * fVar215 + (fStack_3b0 - fVar146) * fVar218;
  fVar289 = (local_3b8 - fVar367) * fVar190 +
            (fStack_3b4 - fVar118) * fVar217 + (fStack_3b0 - fVar146) * fVar219;
  local_2f8 = CONCAT44(fVar289,fVar269);
  fStack_298 = (local_388 - fVar367) * fVar147 +
               (fStack_384 - fVar118) * fVar215 + (fStack_380 - fVar146) * fVar218;
  fStack_294 = (local_388 - fVar367) * fVar190 +
               (fStack_384 - fVar118) * fVar217 + (fStack_380 - fVar146) * fVar219;
  fVar267 = (local_378 - fVar367) * fVar147 +
            (fStack_374 - fVar118) * fVar215 + (fStack_370 - fVar146) * fVar218;
  fVar357 = (local_378 - fVar367) * fVar190 +
            (fStack_374 - fVar118) * fVar217 + (fStack_370 - fVar146) * fVar219;
  uStack_2b0 = CONCAT44(fVar357,fVar267);
  local_2b8 = (local_3dc.m128[1] - fVar367) * fVar147 +
              (local_3dc.m128[2] - fVar118) * fVar215 + (local_3dc.m128[3] - fVar146) * fVar218;
  fStack_2b4 = (local_3dc.m128[1] - fVar367) * fVar190 +
               (local_3dc.m128[2] - fVar118) * fVar217 + (local_3dc.m128[3] - fVar146) * fVar219;
  fVar147 = (local_218 - fVar367) * fVar147 +
            (fStack_214 - fVar118) * fVar215 + (fStack_210 - fVar146) * fVar218;
  fVar367 = (local_218 - fVar367) * fVar190 +
            (fStack_214 - fVar118) * fVar217 + (fStack_210 - fVar146) * fVar219;
  local_338 = CONCAT44(fVar367,fVar147);
  auVar360._8_8_ = uStack_2b0;
  auVar360._0_8_ = local_2e8._0_8_;
  local_b8._8_8_ = local_338;
  local_b8._0_8_ = local_2f8;
  auVar131._8_4_ = fStack_298;
  auVar131._0_8_ = local_2d8._0_8_;
  auVar131._12_4_ = fStack_294;
  auVar193 = minps(auVar131,auVar360);
  auVar170._8_4_ = local_2b8;
  auVar170._0_8_ = local_348;
  auVar170._12_4_ = fStack_2b4;
  auVar235 = minps(auVar170,local_b8);
  auVar193 = minps(auVar193,auVar235);
  auVar171._4_4_ = fVar266;
  auVar171._0_4_ = fVar255;
  auVar171._8_4_ = fStack_298;
  auVar171._12_4_ = fStack_294;
  auVar235 = maxps(auVar171,auVar360);
  auVar204._4_4_ = fVar230;
  auVar204._0_4_ = fVar229;
  auVar204._8_4_ = local_2b8;
  auVar204._12_4_ = fStack_2b4;
  auVar205 = maxps(auVar204,local_b8);
  auVar172 = maxps(auVar235,auVar205);
  auVar31._4_8_ = auVar205._8_8_;
  auVar31._0_4_ = auVar193._4_4_;
  auVar206._0_8_ = auVar31._0_8_ << 0x20;
  auVar206._8_4_ = auVar193._8_4_;
  auVar206._12_4_ = auVar193._12_4_;
  auVar207._8_8_ = auVar193._8_8_;
  auVar207._0_8_ = auVar206._8_8_;
  auVar235 = minps(auVar193,auVar207);
  auVar32._4_8_ = auVar193._8_8_;
  auVar32._0_4_ = auVar172._4_4_;
  auVar208._0_8_ = auVar32._0_8_ << 0x20;
  auVar208._8_4_ = auVar172._8_4_;
  auVar208._12_4_ = auVar172._12_4_;
  auVar209._8_8_ = auVar172._8_8_;
  auVar209._0_8_ = auVar208._8_8_;
  auVar193 = maxps(auVar172,auVar209);
  auVar132._0_8_ = auVar235._0_8_ & 0x7fffffff7fffffff;
  auVar132._8_4_ = auVar235._8_4_ & 0x7fffffff;
  auVar132._12_4_ = auVar235._12_4_ & 0x7fffffff;
  auVar173._0_8_ = auVar193._0_8_ & 0x7fffffff7fffffff;
  auVar173._8_4_ = auVar193._8_4_ & 0x7fffffff;
  auVar173._12_4_ = auVar193._12_4_ & 0x7fffffff;
  auVar193 = maxps(auVar132,auVar173);
  fStack_c4 = auVar193._4_4_;
  local_c8 = fStack_c4;
  if (fStack_c4 <= auVar193._0_4_) {
    local_c8 = auVar193._0_4_;
  }
  local_c8 = local_c8 * 9.536743e-07;
  local_2d8._8_8_ = local_2d8._0_8_;
  local_2e8._8_8_ = local_2e8._0_8_;
  uStack_340 = local_348;
  register0x00001588 = local_2f8;
  register0x00001288 = uStack_2b0;
  local_318 = uStack_2b0;
  register0x00001348 = local_338;
  fStack_c0 = fStack_c4;
  fStack_bc = fStack_c4;
  local_2a8 = local_2d8._0_8_;
  local_88 = fVar189 - fVar255;
  fStack_84 = fVar231 - fVar266;
  fStack_80 = fVar267 - fStack_298;
  fStack_7c = fVar357 - fStack_294;
  local_98 = fVar229 - fVar189;
  fStack_94 = fVar230 - fVar231;
  fStack_90 = local_2b8 - fVar267;
  fStack_8c = fStack_2b4 - fVar357;
  local_2c8 = local_348;
  local_a8 = fVar269 - fVar229;
  fStack_a4 = fVar289 - fVar230;
  fStack_a0 = fVar147 - local_2b8;
  fStack_9c = fVar367 - fStack_2b4;
  local_188 = local_388 - local_398;
  fStack_184 = fStack_384 - fStack_394;
  fStack_180 = fStack_380 - fStack_390;
  fStack_17c = fStack_37c - fStack_38c;
  local_198 = local_378 - local_3a8;
  fStack_194 = fStack_374 - fStack_3a4;
  fStack_190 = fStack_370 - fStack_3a0;
  fStack_18c = fStack_36c - fStack_39c;
  local_1a8 = local_3dc.m128[1] - local_3c8;
  fStack_1a4 = local_3dc.m128[2] - fStack_3c4;
  fStack_1a0 = local_3dc.m128[3] - fStack_3c0;
  fStack_19c = fStack_3cc - fStack_3bc;
  local_1b8 = local_218 - local_3b8;
  fStack_1b4 = fStack_214 - fStack_3b4;
  fStack_1b0 = fStack_210 - fStack_3b0;
  fStack_1ac = fStack_20c - fStack_3ac;
  uVar112 = 0;
  local_428._0_4_ = 0.0;
  local_428._4_4_ = 1.0;
  fStack_420 = 0.0;
  fStack_41c = 0.0;
  fVar146 = 0.0;
  fVar147 = 1.0;
  local_158 = local_c8;
  fStack_154 = local_c8;
  fStack_150 = local_c8;
  fStack_14c = local_c8;
  local_168 = -local_c8;
  fStack_164 = -local_c8;
  fStack_160 = -local_c8;
  fStack_15c = -local_c8;
  local_308 = fStack_298;
  fStack_304 = fStack_294;
  fStack_300 = fStack_298;
  fStack_2fc = fStack_294;
  local_328 = local_2b8;
  fStack_324 = fStack_2b4;
  fStack_320 = local_2b8;
  fStack_31c = fStack_2b4;
  fVar367 = fVar229;
  fVar118 = fVar230;
LAB_0036b77a:
  fVar190 = 1.0 - (float)local_428._0_4_;
  fVar215 = 1.0 - (float)local_428._0_4_;
  fVar217 = 1.0 - (float)local_428._4_4_;
  fVar218 = 1.0 - (float)local_428._4_4_;
  fVar269 = local_2d8._0_4_ * fVar190 + local_308 * (float)local_428._0_4_;
  fVar233 = local_2d8._4_4_ * fVar215 + fStack_304 * (float)local_428._0_4_;
  fVar308 = local_2d8._8_4_ * fVar217 + fStack_300 * (float)local_428._4_4_;
  fVar329 = local_2d8._12_4_ * fVar218 + fStack_2fc * (float)local_428._4_4_;
  fVar219 = local_2e8._0_4_ * fVar190 + local_318._0_4_ * (float)local_428._0_4_;
  fVar365 = local_2e8._4_4_ * fVar215 + local_318._4_4_ * (float)local_428._0_4_;
  fVar345 = local_2e8._8_4_ * fVar217 + local_318._8_4_ * (float)local_428._4_4_;
  fVar232 = local_2e8._12_4_ * fVar218 + local_318._12_4_ * (float)local_428._4_4_;
  fVar392 = fVar229 * fVar190 + local_328 * (float)local_428._0_4_;
  fVar393 = fVar230 * fVar215 + fStack_324 * (float)local_428._0_4_;
  fVar394 = fVar367 * fVar217 + fStack_320 * (float)local_428._4_4_;
  fVar400 = fVar118 * fVar218 + fStack_31c * (float)local_428._4_4_;
  fVar310 = fVar190 * local_2f8._0_4_ + (float)local_428._0_4_ * local_338._0_4_;
  fVar313 = fVar215 * local_2f8._4_4_ + (float)local_428._0_4_ * local_338._4_4_;
  fVar332 = fVar217 * local_2f8._8_4_ + (float)local_428._4_4_ * local_338._8_4_;
  fVar370 = fVar218 * local_2f8._12_4_ + (float)local_428._4_4_ * local_338._12_4_;
  fVar379 = (fVar147 - fVar146) * 0.11111111;
  local_408 = CONCAT44(fVar147,fVar146);
  fVar381 = (fVar147 - fVar146) * 0.0 + fVar146;
  fVar384 = (fVar147 - fVar146) * 0.33333334 + fVar146;
  fVar391 = (fVar147 - fVar146) * 0.6666667 + fVar146;
  fVar146 = (fVar147 - fVar146) * 1.0 + fVar146;
  fVar367 = 1.0 - fVar381;
  fVar118 = 1.0 - fVar384;
  fVar147 = 1.0 - fVar391;
  fVar218 = 1.0 - fVar146;
  fVar229 = fVar219 * fVar367 + fVar392 * fVar381;
  fVar230 = fVar219 * fVar118 + fVar392 * fVar384;
  fVar189 = fVar219 * fVar147 + fVar392 * fVar391;
  fVar231 = fVar219 * fVar218 + fVar392 * fVar146;
  fVar255 = fVar365 * fVar367 + fVar393 * fVar381;
  fVar266 = fVar365 * fVar118 + fVar393 * fVar384;
  fVar267 = fVar365 * fVar147 + fVar393 * fVar391;
  fVar357 = fVar365 * fVar218 + fVar393 * fVar146;
  fVar190 = (fVar269 * fVar367 + fVar219 * fVar381) * fVar367 + fVar381 * fVar229;
  fVar215 = (fVar269 * fVar118 + fVar219 * fVar384) * fVar118 + fVar384 * fVar230;
  fVar217 = (fVar269 * fVar147 + fVar219 * fVar391) * fVar147 + fVar391 * fVar189;
  fVar219 = (fVar269 * fVar218 + fVar219 * fVar146) * fVar218 + fVar146 * fVar231;
  fVar269 = (fVar233 * fVar367 + fVar365 * fVar381) * fVar367 + fVar381 * fVar255;
  fVar289 = (fVar233 * fVar118 + fVar365 * fVar384) * fVar118 + fVar384 * fVar266;
  fVar294 = (fVar233 * fVar147 + fVar365 * fVar391) * fVar147 + fVar391 * fVar267;
  fVar365 = (fVar233 * fVar218 + fVar365 * fVar146) * fVar218 + fVar146 * fVar357;
  fVar229 = fVar229 * fVar367 + (fVar392 * fVar367 + fVar310 * fVar381) * fVar381;
  fVar230 = fVar230 * fVar118 + (fVar392 * fVar118 + fVar310 * fVar384) * fVar384;
  fVar189 = fVar189 * fVar147 + (fVar392 * fVar147 + fVar310 * fVar391) * fVar391;
  fVar231 = fVar231 * fVar218 + (fVar392 * fVar218 + fVar310 * fVar146) * fVar146;
  fVar255 = fVar255 * fVar367 + (fVar393 * fVar367 + fVar313 * fVar381) * fVar381;
  fVar266 = fVar266 * fVar118 + (fVar393 * fVar118 + fVar313 * fVar384) * fVar384;
  fVar267 = fVar267 * fVar147 + (fVar393 * fVar147 + fVar313 * fVar391) * fVar391;
  fVar357 = fVar357 * fVar218 + (fVar393 * fVar218 + fVar313 * fVar146) * fVar146;
  local_258 = fVar367 * fVar190 + fVar381 * fVar229;
  fStack_254 = fVar118 * fVar215 + fVar384 * fVar230;
  fStack_250 = fVar147 * fVar217 + fVar391 * fVar189;
  fStack_24c = fVar218 * fVar219 + fVar146 * fVar231;
  local_148 = fVar367 * fVar269 + fVar381 * fVar255;
  fStack_144 = fVar118 * fVar289 + fVar384 * fVar266;
  fStack_140 = fVar147 * fVar294 + fVar391 * fVar267;
  fStack_13c = fVar218 * fVar365 + fVar146 * fVar357;
  fVar215 = (fVar230 - fVar215) * 3.0 * fVar379;
  fVar217 = (fVar189 - fVar217) * 3.0 * fVar379;
  fVar219 = (fVar231 - fVar219) * 3.0 * fVar379;
  fVar230 = (fVar266 - fVar289) * 3.0 * fVar379;
  fVar189 = (fVar267 - fVar294) * 3.0 * fVar379;
  fVar231 = (fVar357 - fVar365) * 3.0 * fVar379;
  local_228._4_4_ = fStack_250;
  local_228._0_4_ = fStack_254;
  local_228._8_4_ = fStack_24c;
  local_228._12_4_ = 0;
  local_e8._4_4_ = fStack_140;
  local_e8._0_4_ = fStack_144;
  local_238 = local_258 + (fVar229 - fVar190) * 3.0 * fVar379;
  fStack_234 = fStack_254 + fVar215;
  fStack_230 = fStack_250 + fVar217;
  fStack_22c = fStack_24c + fVar219;
  local_368._0_4_ = local_148 + (fVar255 - fVar269) * 3.0 * fVar379;
  local_368._4_4_ = fStack_144 + fVar230;
  fStack_360 = fStack_140 + fVar189;
  fStack_35c = fStack_13c + fVar231;
  local_248._0_4_ = fStack_254 - fVar215;
  local_248._4_4_ = fStack_250 - fVar217;
  local_248._8_4_ = fStack_24c - fVar219;
  local_248._12_4_ = 0;
  auVar133._0_4_ = fStack_144 - fVar230;
  auVar133._4_4_ = fStack_140 - fVar189;
  auVar133._8_4_ = fStack_13c - fVar231;
  auVar133._12_4_ = 0;
  fVar190 = fVar345 * fVar367 + fVar394 * fVar381;
  fVar215 = fVar345 * fVar118 + fVar394 * fVar384;
  fVar217 = fVar345 * fVar147 + fVar394 * fVar391;
  fVar219 = fVar345 * fVar218 + fVar394 * fVar146;
  fVar229 = fVar232 * fVar367 + fVar400 * fVar381;
  fVar230 = fVar232 * fVar118 + fVar400 * fVar384;
  fVar189 = fVar232 * fVar147 + fVar400 * fVar391;
  fVar233 = fVar232 * fVar218 + fVar400 * fVar146;
  fVar231 = (fVar308 * fVar367 + fVar345 * fVar381) * fVar367 + fVar381 * fVar190;
  fVar255 = (fVar308 * fVar118 + fVar345 * fVar384) * fVar118 + fVar384 * fVar215;
  fVar266 = (fVar308 * fVar147 + fVar345 * fVar391) * fVar147 + fVar391 * fVar217;
  fVar267 = (fVar308 * fVar218 + fVar345 * fVar146) * fVar218 + fVar146 * fVar219;
  fVar308 = (fVar329 * fVar367 + fVar232 * fVar381) * fVar367 + fVar381 * fVar229;
  fVar310 = (fVar329 * fVar118 + fVar232 * fVar384) * fVar118 + fVar384 * fVar230;
  fVar313 = (fVar329 * fVar147 + fVar232 * fVar391) * fVar147 + fVar391 * fVar189;
  fVar329 = (fVar329 * fVar218 + fVar232 * fVar146) * fVar218 + fVar146 * fVar233;
  fVar357 = fVar190 * fVar367 + (fVar394 * fVar367 + fVar332 * fVar381) * fVar381;
  fVar269 = fVar215 * fVar118 + (fVar394 * fVar118 + fVar332 * fVar384) * fVar384;
  fVar289 = fVar217 * fVar147 + (fVar394 * fVar147 + fVar332 * fVar391) * fVar391;
  fVar294 = fVar219 * fVar218 + (fVar394 * fVar218 + fVar332 * fVar146) * fVar146;
  fVar365 = fVar229 * fVar367 + (fVar400 * fVar367 + fVar370 * fVar381) * fVar381;
  fVar345 = fVar230 * fVar118 + (fVar400 * fVar118 + fVar370 * fVar384) * fVar384;
  fVar232 = fVar189 * fVar147 + (fVar400 * fVar147 + fVar370 * fVar391) * fVar391;
  fVar233 = fVar233 * fVar218 + (fVar400 * fVar218 + fVar370 * fVar146) * fVar146;
  fVar219 = fVar367 * fVar231 + fVar381 * fVar357;
  fVar229 = fVar118 * fVar255 + fVar384 * fVar269;
  fVar230 = fVar147 * fVar266 + fVar391 * fVar289;
  fVar189 = fVar218 * fVar267 + fVar146 * fVar294;
  fVar190 = fVar367 * fVar308 + fVar381 * fVar365;
  fVar215 = fVar118 * fVar310 + fVar384 * fVar345;
  fVar217 = fVar147 * fVar313 + fVar391 * fVar232;
  fVar218 = fVar218 * fVar329 + fVar146 * fVar233;
  fVar367 = (fVar269 - fVar255) * 3.0 * fVar379;
  fVar118 = (fVar289 - fVar266) * 3.0 * fVar379;
  fVar146 = (fVar294 - fVar267) * 3.0 * fVar379;
  fVar147 = (fVar345 - fVar310) * 3.0 * fVar379;
  fVar255 = (fVar232 - fVar313) * 3.0 * fVar379;
  fVar266 = (fVar233 - fVar329) * 3.0 * fVar379;
  local_f8._4_4_ = fVar230;
  local_f8._0_4_ = fVar229;
  local_f8._8_4_ = fVar189;
  local_f8._12_4_ = 0;
  local_118._4_4_ = fVar217;
  local_118._0_4_ = fVar215;
  local_118._8_4_ = fVar218;
  local_118._12_4_ = 0;
  local_138 = fVar219 + (fVar357 - fVar231) * 3.0 * fVar379;
  fStack_134 = fVar229 + fVar367;
  fStack_130 = fVar230 + fVar118;
  fStack_12c = fVar189 + fVar146;
  local_108 = fVar190 + (fVar365 - fVar308) * 3.0 * fVar379;
  fStack_104 = fVar215 + fVar147;
  fStack_100 = fVar217 + fVar255;
  fStack_fc = fVar218 + fVar266;
  local_d8._0_4_ = fVar229 - fVar367;
  local_d8._4_4_ = fVar230 - fVar118;
  local_d8._8_4_ = fVar189 - fVar146;
  local_d8._12_4_ = 0;
  local_128._0_4_ = fVar215 - fVar147;
  local_128._4_4_ = fVar217 - fVar255;
  local_128._8_4_ = fVar218 - fVar266;
  local_128._12_4_ = 0;
  fVar367 = (fVar229 - fStack_254) + (fVar219 - local_258);
  fVar118 = (fVar230 - fStack_250) + (fVar229 - fStack_254);
  fVar146 = (fVar189 - fStack_24c) + (fVar230 - fStack_250);
  fVar147 = (fVar189 - fStack_24c) + 0.0;
  local_e8._8_4_ = fStack_13c;
  local_e8._12_4_ = 0;
  fVar231 = (fVar215 - fStack_144) + (fVar190 - local_148);
  fVar255 = (fVar217 - fStack_140) + (fVar215 - fStack_144);
  fVar266 = (fVar218 - fStack_13c) + (fVar217 - fStack_140);
  fVar267 = (fVar218 - fStack_13c) + 0.0;
  auVar282._0_8_ =
       CONCAT44(fStack_144 * fVar118 - fStack_254 * fVar255,
                local_148 * fVar367 - local_258 * fVar231);
  auVar282._8_4_ = fStack_140 * fVar146 - fStack_250 * fVar266;
  auVar282._12_4_ = fStack_13c * fVar147 - fStack_24c * fVar267;
  auVar245._0_4_ = (float)local_368._0_4_ * fVar367 - local_238 * fVar231;
  auVar245._4_4_ = (float)local_368._4_4_ * fVar118 - fStack_234 * fVar255;
  auVar245._8_4_ = fStack_360 * fVar146 - fStack_230 * fVar266;
  auVar245._12_4_ = fStack_35c * fVar147 - fStack_22c * fVar267;
  auVar257._0_8_ =
       CONCAT44(auVar133._4_4_ * fVar118 - fVar255 * local_248._4_4_,
                auVar133._0_4_ * fVar367 - fVar231 * local_248._0_4_);
  auVar257._8_4_ = auVar133._8_4_ * fVar146 - fVar266 * local_248._8_4_;
  auVar257._12_4_ = fVar147 * 0.0 - fVar267 * 0.0;
  auVar376._0_4_ = fVar367 * fStack_144 - fVar231 * fStack_254;
  auVar376._4_4_ = fVar118 * fStack_140 - fVar255 * fStack_250;
  auVar376._8_4_ = fVar146 * fStack_13c - fVar266 * fStack_24c;
  auVar376._12_4_ = fVar147 * 0.0 - fVar267 * 0.0;
  auVar322._0_8_ =
       CONCAT44(fVar215 * fVar118 - fVar229 * fVar255,fVar190 * fVar367 - fVar219 * fVar231);
  auVar322._8_4_ = fVar217 * fVar146 - fVar230 * fVar266;
  auVar322._12_4_ = fVar218 * fVar147 - fVar189 * fVar267;
  auVar390._0_4_ = local_108 * fVar367 - local_138 * fVar231;
  auVar390._4_4_ = fStack_104 * fVar118 - fStack_134 * fVar255;
  auVar390._8_4_ = fStack_100 * fVar146 - fStack_130 * fVar266;
  auVar390._12_4_ = fStack_fc * fVar147 - fStack_12c * fVar267;
  auVar299._0_8_ =
       CONCAT44(local_128._4_4_ * fVar118 - fVar255 * local_d8._4_4_,
                local_128._0_4_ * fVar367 - fVar231 * local_d8._0_4_);
  auVar299._8_4_ = local_128._8_4_ * fVar146 - fVar266 * local_d8._8_4_;
  auVar299._12_4_ = fVar147 * 0.0 - fVar267 * 0.0;
  auVar136._0_4_ = fVar367 * fVar215 - fVar231 * fVar229;
  auVar136._4_4_ = fVar118 * fVar217 - fVar255 * fVar230;
  auVar136._8_4_ = fVar146 * fVar218 - fVar266 * fVar189;
  auVar136._12_4_ = fVar147 * 0.0 - fVar267 * 0.0;
  auVar174._8_4_ = auVar282._8_4_;
  auVar174._0_8_ = auVar282._0_8_;
  auVar174._12_4_ = auVar282._12_4_;
  auVar193 = minps(auVar174,auVar245);
  auVar172 = maxps(auVar282,auVar245);
  auVar246._8_4_ = auVar257._8_4_;
  auVar246._0_8_ = auVar257._0_8_;
  auVar246._12_4_ = auVar257._12_4_;
  auVar235 = minps(auVar246,auVar376);
  auVar193 = minps(auVar193,auVar235);
  auVar235 = maxps(auVar257,auVar376);
  auVar205 = maxps(auVar172,auVar235);
  auVar247._8_4_ = auVar322._8_4_;
  auVar247._0_8_ = auVar322._0_8_;
  auVar247._12_4_ = auVar322._12_4_;
  auVar235 = minps(auVar247,auVar390);
  auVar323 = maxps(auVar322,auVar390);
  auVar258._8_4_ = auVar299._8_4_;
  auVar258._0_8_ = auVar299._0_8_;
  auVar258._12_4_ = auVar299._12_4_;
  auVar172 = minps(auVar258,auVar136);
  auVar235 = minps(auVar235,auVar172);
  auVar193 = minps(auVar193,auVar235);
  auVar235 = maxps(auVar299,auVar136);
  auVar235 = maxps(auVar323,auVar235);
  auVar235 = maxps(auVar205,auVar235);
  bVar113 = auVar193._4_4_ <= fStack_154;
  bVar29 = auVar193._8_4_ <= fStack_150;
  bVar30 = auVar193._12_4_ <= fStack_14c;
  auVar94._4_4_ = -(uint)bVar29;
  auVar94._0_4_ = -(uint)bVar113;
  auVar94._8_4_ = -(uint)bVar30;
  auVar94._12_4_ = 0;
  auVar178 = auVar94 << 0x20;
  auVar283._0_4_ =
       -(uint)(local_168 <= auVar235._0_4_ && auVar193._0_4_ <= local_158) & local_178._0_4_;
  auVar283._4_4_ = -(uint)(fStack_164 <= auVar235._4_4_ && bVar113) & local_178._4_4_;
  auVar283._8_4_ = -(uint)(fStack_160 <= auVar235._8_4_ && bVar29) & local_178._8_4_;
  auVar283._12_4_ = -(uint)(fStack_15c <= auVar235._12_4_ && bVar30) & local_178._12_4_;
  uVar114 = movmskps((int)uVar106,auVar283);
  paVar107 = (anon_union_16_2_47237d3f_for_Vec3fx_0 *)(ulong)uVar114;
  if (uVar114 != 0) {
    fVar367 = (fVar229 - fVar219) + (fStack_254 - local_258);
    fVar118 = (fVar230 - fVar229) + (fStack_250 - fStack_254);
    fVar146 = (fVar189 - fVar230) + (fStack_24c - fStack_250);
    fVar147 = (0.0 - fVar189) + (0.0 - fStack_24c);
    fVar231 = (fVar215 - fVar190) + (fStack_144 - local_148);
    fVar255 = (fVar217 - fVar215) + (fStack_140 - fStack_144);
    fVar266 = (fVar218 - fVar217) + (fStack_13c - fStack_140);
    fVar267 = (0.0 - fVar218) + (0.0 - fStack_13c);
    auVar397._0_8_ =
         CONCAT44(fStack_144 * fVar118 - fStack_254 * fVar255,
                  local_148 * fVar367 - local_258 * fVar231);
    auVar397._8_4_ = fStack_140 * fVar146 - fStack_250 * fVar266;
    auVar397._12_4_ = fStack_13c * fVar147 - fStack_24c * fVar267;
    auVar248._0_4_ = (float)local_368._0_4_ * fVar367 - local_238 * fVar231;
    auVar248._4_4_ = (float)local_368._4_4_ * fVar118 - fStack_234 * fVar255;
    auVar248._8_4_ = fStack_360 * fVar146 - fStack_230 * fVar266;
    auVar248._12_4_ = fStack_35c * fVar147 - fStack_22c * fVar267;
    auVar300._0_8_ =
         CONCAT44(auVar133._4_4_ * fVar118 - local_248._4_4_ * fVar255,
                  auVar133._0_4_ * fVar367 - local_248._0_4_ * fVar231);
    auVar300._8_4_ = auVar133._8_4_ * fVar146 - local_248._8_4_ * fVar266;
    auVar300._12_4_ = fVar147 * 0.0 - fVar267 * 0.0;
    auVar259._0_4_ = fStack_144 * fVar367 - fStack_254 * fVar231;
    auVar259._4_4_ = fStack_140 * fVar118 - fStack_250 * fVar255;
    auVar259._8_4_ = fStack_13c * fVar146 - fStack_24c * fVar266;
    auVar259._12_4_ = fVar147 * 0.0 - fVar267 * 0.0;
    auVar210._0_8_ =
         CONCAT44(fVar215 * fVar118 - fVar229 * fVar255,fVar190 * fVar367 - fVar219 * fVar231);
    auVar210._8_4_ = fVar217 * fVar146 - fVar230 * fVar266;
    auVar210._12_4_ = fVar218 * fVar147 - fVar189 * fVar267;
    auVar340._0_4_ = local_108 * fVar367 - local_138 * fVar231;
    auVar340._4_4_ = fStack_104 * fVar118 - fStack_134 * fVar255;
    auVar340._8_4_ = fStack_100 * fVar146 - fStack_130 * fVar266;
    auVar340._12_4_ = fStack_fc * fVar147 - fStack_12c * fVar267;
    auVar377._0_8_ =
         CONCAT44(local_128._4_4_ * fVar118 - local_d8._4_4_ * fVar255,
                  local_128._0_4_ * fVar367 - local_d8._0_4_ * fVar231);
    auVar377._8_4_ = local_128._8_4_ * fVar146 - local_d8._8_4_ * fVar266;
    auVar377._12_4_ = fVar147 * 0.0 - fVar267 * 0.0;
    auVar136._0_4_ = fVar367 * fVar215 - fVar231 * fVar229;
    auVar136._4_4_ = fVar118 * fVar217 - fVar255 * fVar230;
    auVar136._8_4_ = fVar146 * fVar218 - fVar266 * fVar189;
    auVar136._12_4_ = fVar147 * 0.0 - fVar267 * 0.0;
    auVar175._8_4_ = auVar397._8_4_;
    auVar175._0_8_ = auVar397._0_8_;
    auVar175._12_4_ = auVar397._12_4_;
    auVar193 = minps(auVar175,auVar248);
    auVar172 = maxps(auVar397,auVar248);
    auVar249._8_4_ = auVar300._8_4_;
    auVar249._0_8_ = auVar300._0_8_;
    auVar249._12_4_ = auVar300._12_4_;
    auVar235 = minps(auVar249,auVar259);
    auVar193 = minps(auVar193,auVar235);
    auVar235 = maxps(auVar300,auVar259);
    auVar323 = maxps(auVar172,auVar235);
    auVar250._8_4_ = auVar210._8_4_;
    auVar250._0_8_ = auVar210._0_8_;
    auVar250._12_4_ = auVar210._12_4_;
    auVar172 = minps(auVar250,auVar340);
    auVar235 = maxps(auVar210,auVar340);
    auVar260._8_4_ = auVar377._8_4_;
    auVar260._0_8_ = auVar377._0_8_;
    auVar260._12_4_ = auVar377._12_4_;
    auVar205 = minps(auVar260,auVar136);
    auVar172 = minps(auVar172,auVar205);
    auVar193 = minps(auVar193,auVar172);
    auVar172 = maxps(auVar377,auVar136);
    auVar235 = maxps(auVar235,auVar172);
    auVar235 = maxps(auVar323,auVar235);
    bVar113 = auVar193._4_4_ <= fStack_154;
    bVar29 = auVar193._8_4_ <= fStack_150;
    bVar30 = auVar193._12_4_ <= fStack_14c;
    auVar95._4_4_ = -(uint)bVar29;
    auVar95._0_4_ = -(uint)bVar113;
    auVar95._8_4_ = -(uint)bVar30;
    auVar95._12_4_ = 0;
    auVar178 = auVar95 << 0x20;
    auVar398._0_4_ =
         -(uint)(local_168 <= auVar235._0_4_ && auVar193._0_4_ <= local_158) & auVar283._0_4_;
    auVar398._4_4_ = -(uint)(fStack_164 <= auVar235._4_4_ && bVar113) & auVar283._4_4_;
    auVar398._8_4_ = -(uint)(fStack_160 <= auVar235._8_4_ && bVar29) & auVar283._8_4_;
    auVar398._12_4_ = -(uint)(fStack_15c <= auVar235._12_4_ && bVar30) & auVar283._12_4_;
    uVar114 = movmskps(uVar114,auVar398);
    paVar107 = (anon_union_16_2_47237d3f_for_Vec3fx_0 *)(ulong)uVar114;
    auVar390 = local_118;
    if (uVar114 != 0) {
      auStack_208[uVar112] = uVar114 & 0xff;
      *(undefined8 *)(afStack_78 + uVar112 * 2) = local_408;
      *(undefined1 (*) [8])(afStack_58 + uVar112 * 2) = local_428;
      uVar112 = (ulong)((int)uVar112 + 1);
      paVar107 = (anon_union_16_2_47237d3f_for_Vec3fx_0 *)(ulong)(byte)uVar114;
      auVar136 = _local_428;
    }
  }
LAB_0036bddd:
  _local_3f8 = auVar133;
  auVar193 = _local_3f8;
  if ((int)uVar112 == 0) {
    fVar367 = (ray->super_RayK<1>).tfar;
    auVar183._4_4_ = -(uint)(fStack_1c4 <= fVar367);
    auVar183._0_4_ = -(uint)(local_1c8 <= fVar367);
    auVar183._8_4_ = -(uint)(fStack_1c0 <= fVar367);
    auVar183._12_4_ = -(uint)(fStack_1bc <= fVar367);
    uVar114 = movmskps((int)paVar107,auVar183);
    uVar109 = (ulong)((uint)uVar109 & (uint)uVar109 + 0xf & uVar114);
    goto LAB_0036aaab;
  }
  uVar115 = (int)uVar112 - 1;
  uVar106 = (ulong)uVar115;
  uVar114 = auStack_208[uVar106];
  local_428._0_4_ = afStack_58[uVar106 * 2];
  local_428._4_4_ = afStack_58[uVar106 * 2 + 1];
  fStack_420 = 0.0;
  fStack_41c = 0.0;
  uVar13 = 0;
  if (uVar114 != 0) {
    for (; (uVar114 >> uVar13 & 1) == 0; uVar13 = uVar13 + 1) {
    }
  }
  uVar114 = uVar114 - 1 & uVar114;
  auStack_208[uVar106] = uVar114;
  if (uVar114 == 0) {
    uVar112 = (ulong)uVar115;
  }
  fVar147 = (float)(uVar13 + 1) * 0.33333334;
  fVar190 = auVar136._4_4_ * 0.0;
  fVar215 = auVar178._4_4_ * 0.0;
  fVar367 = afStack_78[uVar106 * 2];
  fVar118 = afStack_78[uVar106 * 2 + 1];
  fVar146 = fVar367 * (1.0 - (float)uVar13 * 0.33333334) + fVar118 * (float)uVar13 * 0.33333334;
  fVar147 = fVar367 * (1.0 - fVar147) + fVar118 * fVar147;
  fVar217 = fVar367 * (0.0 - fVar190) + fVar118 * fVar190;
  fVar215 = fVar367 * (0.0 - fVar215) + fVar118 * fVar215;
  fVar190 = fVar147 - fVar146;
  fVar229 = (float)local_348;
  fVar230 = local_348._4_4_;
  fVar367 = (float)uStack_340;
  fVar118 = uStack_340._4_4_;
  if (fVar190 < 0.16666667) {
    fVar266 = 1.0 - (float)local_428._0_4_;
    fVar357 = 1.0 - (float)local_428._0_4_;
    fVar294 = 1.0 - (float)local_428._4_4_;
    fVar365 = 1.0 - (float)local_428._4_4_;
    fVar255 = local_2d8._0_4_ * fVar266 + local_308 * (float)local_428._0_4_;
    fVar267 = local_2d8._4_4_ * fVar357 + fStack_304 * (float)local_428._0_4_;
    fVar269 = local_2d8._8_4_ * fVar294 + fStack_300 * (float)local_428._4_4_;
    fVar289 = local_2d8._12_4_ * fVar365 + fStack_2fc * (float)local_428._4_4_;
    fVar218 = local_2e8._0_4_ * fVar266 + (float)local_318._0_4_ * (float)local_428._0_4_;
    fVar219 = local_2e8._4_4_ * fVar357 + (float)local_318._4_4_ * (float)local_428._0_4_;
    fVar189 = local_2e8._8_4_ * fVar294 + fStack_310 * (float)local_428._4_4_;
    fVar231 = local_2e8._12_4_ * fVar365 + fStack_30c * (float)local_428._4_4_;
    fVar310 = (float)local_348 * fVar266 + local_328 * (float)local_428._0_4_;
    fVar329 = local_348._4_4_ * fVar357 + fStack_324 * (float)local_428._0_4_;
    fVar370 = (float)uStack_340 * fVar294 + fStack_320 * (float)local_428._4_4_;
    fVar381 = uStack_340._4_4_ * fVar365 + fStack_31c * (float)local_428._4_4_;
    fVar345 = (fVar266 * (float)local_2f8._0_4_ + (float)local_428._0_4_ * (float)local_338._0_4_) -
              fVar310;
    fVar232 = (fVar357 * (float)local_2f8._4_4_ + (float)local_428._0_4_ * (float)local_338._4_4_) -
              fVar329;
    fVar233 = (fVar294 * fStack_2f0 + (float)local_428._4_4_ * fStack_330) - fVar370;
    fVar308 = (fVar365 * fStack_2ec + (float)local_428._4_4_ * fStack_32c) - fVar381;
    fVar266 = fVar146 * (fVar310 - fVar218) + fVar218;
    fVar357 = fVar146 * (fVar329 - fVar219) + fVar219;
    fVar294 = fVar146 * (fVar370 - fVar189) + fVar189;
    fVar365 = fVar146 * (fVar381 - fVar231) + fVar231;
    fVar313 = (fVar310 - fVar218) * fVar147 + fVar218;
    fVar332 = (fVar329 - fVar219) * fVar147 + fVar219;
    fVar379 = (fVar370 - fVar189) * fVar147 + fVar189;
    fVar384 = (fVar381 - fVar231) * fVar147 + fVar231;
    fVar391 = fVar146 * (fVar218 - fVar255) + fVar255;
    fVar392 = fVar146 * (fVar219 - fVar267) + fVar267;
    fVar393 = fVar146 * (fVar189 - fVar269) + fVar269;
    fVar394 = fVar146 * (fVar231 - fVar289) + fVar289;
    fVar391 = (fVar266 - fVar391) * fVar146 + fVar391;
    fVar392 = (fVar357 - fVar392) * fVar146 + fVar392;
    fVar393 = (fVar294 - fVar393) * fVar146 + fVar393;
    fVar394 = (fVar365 - fVar394) * fVar146 + fVar394;
    fVar266 = (((fVar146 * fVar345 + fVar310) - fVar266) * fVar146 + fVar266) - fVar391;
    fVar357 = (((fVar146 * fVar232 + fVar329) - fVar357) * fVar146 + fVar357) - fVar392;
    fVar294 = (((fVar146 * fVar233 + fVar370) - fVar294) * fVar146 + fVar294) - fVar393;
    fVar365 = (((fVar146 * fVar308 + fVar381) - fVar365) * fVar146 + fVar365) - fVar394;
    auVar211._0_4_ = fVar146 * fVar266 + fVar391;
    auVar211._4_4_ = fVar146 * fVar357 + fVar392;
    auVar211._8_4_ = fVar146 * fVar294 + fVar393;
    auVar211._12_4_ = fVar146 * fVar365 + fVar394;
    fVar255 = (fVar218 - fVar255) * fVar147 + fVar255;
    fVar267 = (fVar219 - fVar267) * fVar147 + fVar267;
    fVar269 = (fVar189 - fVar269) * fVar147 + fVar269;
    fVar289 = (fVar231 - fVar289) * fVar147 + fVar289;
    fVar255 = (fVar313 - fVar255) * fVar147 + fVar255;
    fVar267 = (fVar332 - fVar267) * fVar147 + fVar267;
    fVar269 = (fVar379 - fVar269) * fVar147 + fVar269;
    fVar289 = (fVar384 - fVar289) * fVar147 + fVar289;
    fVar219 = (((fVar345 * fVar147 + fVar310) - fVar313) * fVar147 + fVar313) - fVar255;
    fVar189 = (((fVar232 * fVar147 + fVar329) - fVar332) * fVar147 + fVar332) - fVar267;
    fVar231 = (((fVar233 * fVar147 + fVar370) - fVar379) * fVar147 + fVar379) - fVar269;
    fVar332 = (((fVar308 * fVar147 + fVar381) - fVar384) * fVar147 + fVar384) - fVar289;
    fVar255 = fVar147 * fVar219 + fVar255;
    fVar267 = fVar147 * fVar189 + fVar267;
    fVar269 = fVar147 * fVar231 + fVar269;
    fVar289 = fVar147 * fVar332 + fVar289;
    fVar218 = fVar190 * 0.33333334;
    fVar345 = fVar266 * (float)DAT_01f4afa0 * fVar218 + auVar211._0_4_;
    fVar232 = fVar357 * DAT_01f4afa0._4_4_ * fVar218 + auVar211._4_4_;
    fVar233 = fVar294 * DAT_01f4afa0._8_4_ * fVar218 + auVar211._8_4_;
    fVar308 = fVar365 * DAT_01f4afa0._12_4_ * fVar218 + auVar211._12_4_;
    fVar310 = fVar255 - fVar218 * fVar219 * (float)DAT_01f4afa0;
    fVar313 = fVar267 - fVar218 * fVar189 * DAT_01f4afa0._4_4_;
    fVar329 = fVar269 - fVar218 * fVar231 * DAT_01f4afa0._8_4_;
    fVar332 = fVar289 - fVar218 * fVar332 * DAT_01f4afa0._12_4_;
    auVar33._4_8_ = auVar390._8_8_;
    auVar33._0_4_ = auVar211._4_4_;
    auVar388._0_8_ = auVar33._0_8_ << 0x20;
    auVar388._8_4_ = auVar211._8_4_;
    auVar388._12_4_ = auVar211._12_4_;
    auVar390._8_8_ = auVar211._8_8_;
    auVar390._0_8_ = auVar388._8_8_;
    auVar34._4_8_ = DAT_01f4afa0._8_8_;
    auVar34._0_4_ = fVar267;
    auVar301._0_8_ = auVar34._0_8_ << 0x20;
    auVar301._8_4_ = fVar269;
    auVar301._12_4_ = fVar289;
    fVar266 = (fVar269 - fVar255) + (auVar211._8_4_ - auVar211._0_4_);
    fVar357 = (fVar289 - fVar267) + (auVar211._12_4_ - auVar211._4_4_);
    auVar324._0_4_ = fVar313 * fVar357;
    auVar324._4_4_ = fVar313 * fVar357;
    auVar324._8_4_ = fVar332 * fVar357;
    auVar324._12_4_ = fVar332 * fVar357;
    fVar218 = auVar211._0_4_ * fVar266 + auVar211._4_4_ * fVar357;
    fVar219 = auVar211._8_4_ * fVar266 + auVar211._12_4_ * fVar357;
    fVar294 = fVar345 * fVar266 + fVar232 * fVar357;
    fVar365 = fVar233 * fVar266 + fVar308 * fVar357;
    fVar370 = fVar310 * fVar266 + auVar324._0_4_;
    auVar284._0_8_ = CONCAT44(fVar313 * fVar266 + auVar324._4_4_,fVar370);
    auVar284._8_4_ = fVar329 * fVar266 + auVar324._8_4_;
    auVar284._12_4_ = fVar332 * fVar266 + auVar324._12_4_;
    fVar231 = fVar266 * fVar255 + fVar357 * fVar267;
    fVar379 = fVar266 * fVar269 + fVar357 * fVar289;
    auVar35._4_8_ = auVar324._8_8_;
    auVar35._0_4_ = fVar232 * fVar266 + fVar232 * fVar357;
    auVar325._0_8_ = auVar35._0_8_ << 0x20;
    auVar325._8_4_ = fVar365;
    auVar325._12_4_ = fVar308 * fVar266 + fVar308 * fVar357;
    fVar189 = fVar294;
    if (fVar294 <= fVar218) {
      fVar189 = fVar218;
      fVar218 = fVar294;
    }
    auVar326._8_8_ = auVar325._8_8_;
    auVar326._0_8_ = auVar326._8_8_;
    auVar134._8_4_ = auVar284._8_4_;
    auVar134._0_8_ = auVar284._0_8_;
    auVar134._12_4_ = auVar284._12_4_;
    if (fVar231 <= fVar370) {
      auVar134._0_4_ = fVar231;
    }
    if (auVar134._0_4_ <= fVar218) {
      fVar218 = auVar134._0_4_;
    }
    auVar36._4_8_ = auVar134._8_8_;
    auVar36._0_4_ = fVar266 * fVar267 + fVar357 * fVar267;
    auVar135._0_8_ = auVar36._0_8_ << 0x20;
    auVar135._8_4_ = fVar379;
    auVar135._12_4_ = fVar266 * fVar289 + fVar357 * fVar289;
    if (fVar231 <= fVar370) {
      fVar231 = fVar370;
    }
    auVar136._8_8_ = auVar135._8_8_;
    auVar136._0_8_ = auVar136._8_8_;
    if (fVar231 <= fVar189) {
      fVar231 = fVar189;
    }
    if (fVar365 <= fVar219) {
      auVar326._0_4_ = fVar219;
      fVar219 = fVar365;
    }
    auVar176._8_4_ = auVar284._8_4_;
    auVar176._0_8_ = auVar284._8_8_;
    auVar176._12_4_ = auVar284._12_4_;
    if (fVar379 <= auVar284._8_4_) {
      auVar176._0_4_ = fVar379;
    }
    if (auVar176._0_4_ <= fVar219) {
      fVar219 = auVar176._0_4_;
    }
    if (fVar379 <= auVar284._8_4_) {
      auVar136._0_4_ = auVar284._8_4_;
    }
    if (auVar136._0_4_ <= auVar326._0_4_) {
      auVar136._0_4_ = auVar326._0_4_;
    }
    bVar113 = 3 < (uint)uVar112;
    uVar37 = (undefined3)(uVar115 >> 8);
    fVar189 = auVar136._0_4_;
    if ((0.0001 <= fVar218) || (fVar189 <= -0.0001)) goto LAB_0036c0f3;
    goto LAB_0036c13c;
  }
  goto LAB_0036b77a;
LAB_0036c0f3:
  auVar178._0_12_ = ZEXT812(0x38d1b717);
  auVar178._12_4_ = 0.0;
  if ((0.0001 <= fVar219 || fVar231 <= -0.0001) &&
     ((0.0001 <= fVar218 || fVar231 <= -0.0001 &&
      (paVar107 = (anon_union_16_2_47237d3f_for_Vec3fx_0 *)(ulong)CONCAT31(uVar37,bVar113),
      auVar133 = _local_3f8, 0.0001 <= fVar219 || fVar189 <= -0.0001)))) goto LAB_0036bddd;
LAB_0036c13c:
  _local_368 = auVar390;
  local_3f8 = (undefined1  [8])auVar301._8_8_;
  auVar133 = _local_3f8;
  local_3e8 = CONCAT44(fVar289,fVar269);
  bVar113 = bVar113 || fVar190 < 0.001;
  paVar107 = (anon_union_16_2_47237d3f_for_Vec3fx_0 *)(ulong)CONCAT31(uVar37,bVar113);
  fVar357 = (float)(~-(uint)(fVar218 < 0.0) & 0x3f800000 | -(uint)(fVar218 < 0.0) & 0xbf800000);
  fVar294 = (float)(~-(uint)(fVar231 < 0.0) & 0x3f800000 | -(uint)(fVar231 < 0.0) & 0xbf800000);
  fVar266 = 0.0;
  if ((fVar357 == fVar294) && (!NAN(fVar357) && !NAN(fVar294))) {
    fVar266 = INFINITY;
  }
  fVar365 = 0.0;
  if ((fVar357 == fVar294) && (!NAN(fVar357) && !NAN(fVar294))) {
    fVar365 = -INFINITY;
  }
  fVar370 = (float)(~-(uint)(fVar219 < 0.0) & 0x3f800000 | -(uint)(fVar219 < 0.0) & 0xbf800000);
  if ((fVar357 != fVar370) || (fVar379 = fVar365, NAN(fVar357) || NAN(fVar370))) {
    if ((fVar219 != fVar218) || (NAN(fVar219) || NAN(fVar218))) {
      fVar219 = -fVar218 / (fVar219 - fVar218);
      fVar219 = (1.0 - fVar219) * 0.0 + fVar219;
      fVar379 = fVar219;
    }
    else {
      fVar219 = 0.0;
      if ((fVar218 != 0.0) || (fVar379 = 1.0, NAN(fVar218))) {
        fVar219 = INFINITY;
        fVar379 = -INFINITY;
      }
    }
    if (fVar219 <= fVar266) {
      fVar266 = fVar219;
    }
    if (fVar379 <= fVar365) {
      fVar379 = fVar365;
    }
  }
  fVar218 = *(float *)(&DAT_01f4bed4 + (ulong)(fVar189 < 0.0) * 4);
  if ((fVar294 != fVar218) || (fVar219 = fVar379, NAN(fVar294) || NAN(fVar218))) {
    if ((fVar189 != fVar231) || (NAN(fVar189) || NAN(fVar231))) {
      fVar357 = -fVar231 / (fVar189 - fVar231);
      fVar357 = (1.0 - fVar357) * 0.0 + fVar357;
      fVar219 = fVar357;
    }
    else {
      fVar357 = 0.0;
      if ((fVar231 != 0.0) || (fVar219 = 1.0, NAN(fVar231))) {
        fVar357 = INFINITY;
        fVar219 = -INFINITY;
      }
    }
    if (fVar357 <= fVar266) {
      fVar266 = fVar357;
    }
    if (fVar219 <= fVar379) {
      fVar219 = fVar379;
    }
  }
  if ((fVar370 != fVar218) || (NAN(fVar370) || NAN(fVar218))) {
    fVar266 = (float)(~-(uint)(fVar266 < 1.0) & 0x3f800000 | (uint)fVar266 & -(uint)(fVar266 < 1.0))
    ;
    fVar219 = (float)(~-(uint)(fVar219 < 1.0) & (uint)fVar219 | -(uint)(fVar219 < 1.0) & 0x3f800000)
    ;
  }
  fStack_3f0 = auVar193._8_4_;
  fStack_3ec = auVar193._12_4_;
  auVar177._0_8_ =
       CONCAT44(~-(uint)(fVar219 < 1.0),~-(uint)(fVar266 < 0.0) & (uint)fVar266) &
       0x3f800000ffffffff;
  auVar177._8_8_ = 0;
  auVar178 = auVar177 | ZEXT416((uint)fVar219 & -(uint)(fVar219 < 1.0)) << 0x20;
  fVar218 = auVar178._4_4_;
  auVar136._4_4_ = fVar218;
  auVar136._0_4_ = fVar218;
  auVar136._8_4_ = fVar218;
  auVar136._12_4_ = fVar218;
  if (fVar218 < auVar178._0_4_) goto LAB_0036bddd;
  fVar219 = auVar178._0_4_ + -0.1;
  fVar231 = auVar178._8_4_ + 0.0;
  fVar266 = auVar178._12_4_ + 0.0;
  uVar114 = -(uint)(fVar218 + 0.1 < 1.0);
  fVar219 = (float)(~-(uint)(fVar219 < 0.0) & (uint)fVar219);
  fVar218 = (float)(~uVar114 & 0x3f800000 | (uint)(fVar218 + 0.1) & uVar114);
  fVar384 = 1.0 - fVar219;
  fVar391 = 1.0 - fVar219;
  fVar392 = 1.0 - fVar218;
  fVar393 = 1.0 - fVar218;
  fVar357 = auVar211._0_4_ * fVar384 + auVar211._8_4_ * fVar219;
  fVar294 = auVar211._4_4_ * fVar391 + auVar211._12_4_ * fVar219;
  fVar365 = auVar211._0_4_ * fVar392 + auVar211._8_4_ * fVar218;
  fVar370 = auVar211._4_4_ * fVar393 + auVar211._12_4_ * fVar218;
  fVar379 = fVar345 * fVar384 + fVar233 * fVar219;
  fVar381 = fVar232 * fVar391 + fVar308 * fVar219;
  fVar345 = fVar345 * fVar392 + fVar233 * fVar218;
  fVar232 = fVar232 * fVar393 + fVar308 * fVar218;
  fVar233 = fVar310 * fVar384 + fVar329 * fVar219;
  fVar308 = fVar313 * fVar391 + fVar332 * fVar219;
  fVar310 = fVar310 * fVar392 + fVar329 * fVar218;
  fVar313 = fVar313 * fVar393 + fVar332 * fVar218;
  fVar329 = fVar384 * fVar255 + fVar269 * fVar219;
  fVar289 = fVar391 * fVar267 + fVar289 * fVar219;
  fVar332 = fVar392 * fVar255 + fStack_3f0 * fVar218;
  fVar384 = fVar393 * fVar267 + fStack_3ec * fVar218;
  fVar255 = (float)local_428._4_4_ * fVar231;
  fVar267 = (float)local_428._4_4_ * fVar266;
  fVar391 = (float)local_428._0_4_ * (1.0 - fVar218);
  fStack_420 = (float)local_428._0_4_ * (0.0 - fVar231);
  fStack_41c = (float)local_428._0_4_ * (0.0 - fVar266);
  local_428._0_4_ = (float)local_428._0_4_ * (1.0 - fVar219) + (float)local_428._4_4_ * fVar219;
  local_428._4_4_ = fVar391 + (float)local_428._4_4_ * fVar218;
  fStack_420 = fStack_420 + fVar255;
  fStack_41c = fStack_41c + fVar267;
  fVar190 = 1.0 / fVar190;
  auVar179._0_4_ = fVar332 - fVar329;
  auVar179._4_4_ = fVar384 - fVar289;
  auVar179._8_4_ = fVar332 - fVar332;
  auVar179._12_4_ = fVar384 - fVar384;
  auVar226._0_8_ = CONCAT44(fVar313 - fVar308,fVar310 - fVar233);
  auVar226._8_4_ = fVar310 - fVar310;
  auVar226._12_4_ = fVar313 - fVar313;
  auVar261._0_4_ = fVar345 - fVar379;
  auVar261._4_4_ = fVar232 - fVar381;
  auVar261._8_4_ = fVar345 - fVar345;
  auVar261._12_4_ = fVar232 - fVar232;
  auVar327._0_8_ = CONCAT44((fVar381 - fVar294) * 3.0,(fVar379 - fVar357) * 3.0);
  auVar327._8_4_ = (fVar345 - fVar365) * 3.0;
  auVar327._12_4_ = (fVar232 - fVar370) * 3.0;
  auVar251._0_8_ = CONCAT44((fVar308 - fVar381) * 3.0,(fVar233 - fVar379) * 3.0);
  auVar251._8_4_ = (fVar310 - fVar345) * 3.0;
  auVar251._12_4_ = (fVar313 - fVar232) * 3.0;
  auVar361._0_4_ = (fVar329 - fVar233) * 3.0;
  auVar361._4_4_ = (fVar289 - fVar308) * 3.0;
  auVar361._8_4_ = (fVar332 - fVar310) * 3.0;
  auVar361._12_4_ = (fVar384 - fVar313) * 3.0;
  auVar285._8_4_ = auVar251._8_4_;
  auVar285._0_8_ = auVar251._0_8_;
  auVar285._12_4_ = auVar251._12_4_;
  auVar235 = minps(auVar285,auVar361);
  auVar193 = maxps(auVar251,auVar361);
  auVar341._8_4_ = auVar327._8_4_;
  auVar341._0_8_ = auVar327._0_8_;
  auVar341._12_4_ = auVar327._12_4_;
  auVar205 = minps(auVar341,auVar235);
  auVar172 = maxps(auVar327,auVar193);
  auVar38._4_8_ = auVar193._8_8_;
  auVar38._0_4_ = auVar205._4_4_;
  auVar252._0_8_ = auVar38._0_8_ << 0x20;
  auVar252._8_4_ = auVar205._8_4_;
  auVar252._12_4_ = auVar205._12_4_;
  auVar253._8_8_ = auVar205._8_8_;
  auVar253._0_8_ = auVar252._8_8_;
  auVar39._4_8_ = auVar235._8_8_;
  auVar39._0_4_ = auVar172._4_4_;
  auVar286._0_8_ = auVar39._0_8_ << 0x20;
  auVar286._8_4_ = auVar172._8_4_;
  auVar286._12_4_ = auVar172._12_4_;
  auVar287._8_8_ = auVar172._8_8_;
  auVar287._0_8_ = auVar286._8_8_;
  auVar235 = minps(auVar205,auVar253);
  auVar193 = maxps(auVar172,auVar287);
  fVar392 = auVar235._0_4_ * fVar190;
  fVar393 = auVar235._4_4_ * fVar190;
  fVar394 = auVar235._8_4_ * fVar190;
  fVar400 = auVar235._12_4_ * fVar190;
  fVar233 = fVar190 * auVar193._0_4_;
  fVar310 = fVar190 * auVar193._4_4_;
  fVar329 = fVar190 * auVar193._8_4_;
  fVar190 = fVar190 * auVar193._12_4_;
  fVar384 = 1.0 / ((float)local_428._4_4_ - (float)local_428._0_4_);
  auVar137._0_8_ = CONCAT44(fVar370 - fVar294,fVar365 - fVar357);
  auVar137._8_4_ = fVar365 - fVar365;
  auVar137._12_4_ = fVar370 - fVar370;
  auVar302._8_4_ = auVar137._8_4_;
  auVar302._0_8_ = auVar137._0_8_;
  auVar302._12_4_ = auVar137._12_4_;
  auVar172 = minps(auVar302,auVar261);
  auVar193 = maxps(auVar137,auVar261);
  auVar212._8_4_ = auVar226._8_4_;
  auVar212._0_8_ = auVar226._0_8_;
  auVar212._12_4_ = auVar226._12_4_;
  auVar235 = minps(auVar212,auVar179);
  auVar172 = minps(auVar172,auVar235);
  auVar235 = maxps(auVar226,auVar179);
  auVar193 = maxps(auVar193,auVar235);
  fVar379 = auVar172._0_4_ * fVar384;
  fVar381 = auVar172._4_4_ * fVar384;
  fVar391 = fVar384 * auVar193._0_4_;
  fVar384 = fVar384 * auVar193._4_4_;
  local_3f8._4_4_ = local_428._0_4_;
  local_3f8._0_4_ = fVar146;
  fStack_3f0 = fVar147;
  fStack_3ec = (float)local_428._4_4_;
  auVar288._4_4_ = local_428._4_4_;
  auVar288._0_4_ = fVar147;
  auVar288._8_4_ = fVar217;
  auVar288._12_4_ = fVar215;
  fVar294 = (fVar146 + fVar147) * 0.5;
  fVar365 = ((float)local_428._0_4_ + (float)local_428._4_4_) * 0.5;
  fVar345 = (fVar147 + fVar217) * 0.0;
  fVar232 = ((float)local_428._4_4_ + fVar215) * 0.0;
  fVar218 = local_88 * fVar294 + (float)local_2a8;
  fVar219 = fStack_84 * fVar294 + local_2a8._4_4_;
  fVar231 = fStack_80 * fVar294 + fStack_2a0;
  fVar255 = fStack_7c * fVar294 + fStack_29c;
  fVar266 = local_98 * fVar294 + local_2b8;
  fVar267 = fStack_94 * fVar294 + fStack_2b4;
  fVar357 = fStack_90 * fVar294 + (float)uStack_2b0;
  fVar289 = fStack_8c * fVar294 + uStack_2b0._4_4_;
  fVar218 = (fVar266 - fVar218) * fVar294 + fVar218;
  fVar219 = (fVar267 - fVar219) * fVar294 + fVar219;
  fVar231 = (fVar357 - fVar231) * fVar294 + fVar231;
  fVar255 = (fVar289 - fVar255) * fVar294 + fVar255;
  fVar266 = (((local_a8 * fVar294 + (float)local_2c8) - fVar266) * fVar294 + fVar266) - fVar218;
  fVar267 = (((fStack_a4 * fVar294 + local_2c8._4_4_) - fVar267) * fVar294 + fVar267) - fVar219;
  fVar357 = (((fStack_a0 * fVar294 + fStack_2c0) - fVar357) * fVar294 + fVar357) - fVar231;
  fVar289 = (((fStack_9c * fVar294 + fStack_2bc) - fVar289) * fVar294 + fVar289) - fVar255;
  fVar218 = fVar294 * fVar266 + fVar218;
  fVar219 = fVar294 * fVar267 + fVar219;
  fVar266 = fVar266 * 3.0;
  fVar267 = fVar267 * 3.0;
  fVar231 = (fVar294 * fVar357 + fVar231) - fVar218;
  fVar255 = (fVar294 * fVar289 + fVar255) - fVar219;
  fVar266 = (fVar357 * 3.0 - fVar266) * fVar365 + fVar266;
  fVar267 = (fVar289 * 3.0 - fVar267) * fVar365 + fVar267;
  auVar227._0_8_ = CONCAT44(fVar266,fVar231) ^ 0x80000000;
  auVar227._8_4_ = fVar266;
  auVar227._12_4_ = fVar266;
  fVar401 = fVar146 - fVar294;
  fVar402 = (float)local_428._0_4_ - fVar365;
  fVar403 = fVar147 - fVar345;
  fVar409 = (float)local_428._4_4_ - fVar232;
  fVar410 = fVar147 - fVar294;
  fVar411 = (float)local_428._4_4_ - fVar365;
  fVar217 = fVar217 - fVar345;
  fVar215 = fVar215 - fVar232;
  fVar218 = fVar231 * fVar365 + fVar218;
  fVar219 = fVar255 * fVar365 + fVar219;
  auVar254._0_8_ = CONCAT44(fVar267,fVar255) ^ 0x8000000000000000;
  auVar254._8_4_ = -fVar267;
  auVar254._12_4_ = -fVar267;
  auVar138._0_4_ = fVar255 * fVar266 - fVar267 * fVar231;
  auVar138._4_4_ = auVar138._0_4_;
  auVar138._8_4_ = auVar138._0_4_;
  auVar138._12_4_ = auVar138._0_4_;
  auVar235 = divps(auVar254,auVar138);
  auVar193 = divps(auVar227,auVar138);
  fVar345 = auVar235._0_4_;
  fVar232 = auVar235._4_4_;
  fVar357 = auVar193._0_4_;
  fVar289 = auVar193._4_4_;
  fVar294 = fVar294 - (fVar219 * fVar357 + fVar218 * fVar345);
  fVar266 = fVar365 - (fVar219 * fVar289 + fVar218 * fVar232);
  fVar267 = fVar365 - (fVar219 * auVar193._8_4_ + fVar218 * auVar235._8_4_);
  fVar365 = fVar365 - (fVar219 * auVar193._12_4_ + fVar218 * auVar235._12_4_);
  auVar180._0_8_ = CONCAT44(fVar232 * fVar379,fVar232 * fVar392);
  auVar180._8_4_ = fVar232 * fVar393;
  auVar180._12_4_ = fVar232 * fVar381;
  auVar139._0_4_ = fVar232 * fVar233;
  auVar139._4_4_ = fVar232 * fVar391;
  auVar139._8_4_ = fVar232 * fVar310;
  auVar139._12_4_ = fVar232 * fVar384;
  auVar408._8_4_ = auVar180._8_4_;
  auVar408._0_8_ = auVar180._0_8_;
  auVar408._12_4_ = auVar180._12_4_;
  auVar205 = minps(auVar408,auVar139);
  auVar193 = maxps(auVar139,auVar180);
  auVar262._0_8_ = CONCAT44(fVar289 * fVar381,fVar289 * fVar393);
  auVar262._8_4_ = fVar289 * fVar394;
  auVar262._12_4_ = fVar289 * fVar400;
  auVar181._0_4_ = fVar289 * fVar310;
  auVar181._4_4_ = fVar289 * fVar384;
  auVar181._8_4_ = fVar289 * fVar329;
  auVar181._12_4_ = fVar289 * fVar190;
  auVar342._8_4_ = auVar262._8_4_;
  auVar342._0_8_ = auVar262._0_8_;
  auVar342._12_4_ = auVar262._12_4_;
  auVar172 = minps(auVar342,auVar181);
  auVar235 = maxps(auVar181,auVar262);
  fVar218 = 0.0 - (auVar235._0_4_ + auVar193._0_4_);
  fVar219 = 1.0 - (auVar235._4_4_ + auVar193._4_4_);
  fVar231 = 0.0 - (auVar235._8_4_ + auVar193._8_4_);
  fVar255 = 0.0 - (auVar235._12_4_ + auVar193._12_4_);
  fVar308 = 0.0 - (auVar172._0_4_ + auVar205._0_4_);
  fVar313 = 1.0 - (auVar172._4_4_ + auVar205._4_4_);
  fVar332 = 0.0 - (auVar172._8_4_ + auVar205._8_4_);
  fVar370 = 0.0 - (auVar172._12_4_ + auVar205._12_4_);
  auVar182._0_8_ = CONCAT44(fVar402 * fVar219,fVar401 * fVar218);
  auVar182._8_4_ = fVar403 * fVar231;
  auVar182._12_4_ = fVar409 * fVar255;
  auVar362._0_8_ = CONCAT44(fVar379 * fVar345,fVar392 * fVar345);
  auVar362._8_4_ = fVar393 * fVar345;
  auVar362._12_4_ = fVar381 * fVar345;
  auVar263._0_4_ = fVar345 * fVar233;
  auVar263._4_4_ = fVar345 * fVar391;
  auVar263._8_4_ = fVar345 * fVar310;
  auVar263._12_4_ = fVar345 * fVar384;
  auVar343._8_4_ = auVar362._8_4_;
  auVar343._0_8_ = auVar362._0_8_;
  auVar343._12_4_ = auVar362._12_4_;
  auVar235 = minps(auVar343,auVar263);
  auVar193 = maxps(auVar263,auVar362);
  auVar303._0_8_ = CONCAT44(fVar381 * fVar357,fVar393 * fVar357);
  auVar303._8_4_ = fVar394 * fVar357;
  auVar303._12_4_ = fVar400 * fVar357;
  auVar363._0_4_ = fVar357 * fVar310;
  auVar363._4_4_ = fVar357 * fVar384;
  auVar363._8_4_ = fVar357 * fVar329;
  auVar363._12_4_ = fVar357 * fVar190;
  auVar399._8_4_ = auVar303._8_4_;
  auVar399._0_8_ = auVar303._0_8_;
  auVar399._12_4_ = auVar303._12_4_;
  auVar205 = minps(auVar399,auVar363);
  auVar344._0_4_ = fVar401 * fVar308;
  auVar344._4_4_ = fVar402 * fVar313;
  auVar344._8_4_ = fVar403 * fVar332;
  auVar344._12_4_ = fVar409 * fVar370;
  auVar140._0_8_ = CONCAT44(fVar219 * fVar411,fVar218 * fVar410);
  auVar140._8_4_ = fVar231 * fVar217;
  auVar140._12_4_ = fVar255 * fVar215;
  auVar268._0_4_ = fVar308 * fVar410;
  auVar268._4_4_ = fVar313 * fVar411;
  auVar268._8_4_ = fVar332 * fVar217;
  auVar268._12_4_ = fVar370 * fVar215;
  auVar172 = maxps(auVar363,auVar303);
  fVar190 = 1.0 - (auVar172._0_4_ + auVar193._0_4_);
  fVar218 = 0.0 - (auVar172._4_4_ + auVar193._4_4_);
  fVar219 = 0.0 - (auVar172._8_4_ + auVar193._8_4_);
  fVar231 = 0.0 - (auVar172._12_4_ + auVar193._12_4_);
  fVar255 = 1.0 - (auVar205._0_4_ + auVar235._0_4_);
  fVar233 = 0.0 - (auVar205._4_4_ + auVar235._4_4_);
  fVar308 = 0.0 - (auVar205._8_4_ + auVar235._8_4_);
  fVar310 = 0.0 - (auVar205._12_4_ + auVar235._12_4_);
  auVar304._0_8_ = CONCAT44(fVar402 * fVar218,fVar401 * fVar190);
  auVar304._8_4_ = fVar403 * fVar219;
  auVar304._12_4_ = fVar409 * fVar231;
  auVar378._0_4_ = fVar401 * fVar255;
  auVar378._4_4_ = fVar402 * fVar233;
  auVar378._8_4_ = fVar403 * fVar308;
  auVar378._12_4_ = fVar409 * fVar310;
  auVar264._0_8_ = CONCAT44(fVar218 * fVar411,fVar190 * fVar410);
  auVar264._8_4_ = fVar219 * fVar217;
  auVar264._12_4_ = fVar231 * fVar215;
  auVar328._0_4_ = fVar255 * fVar410;
  auVar328._4_4_ = fVar233 * fVar411;
  auVar328._8_4_ = fVar308 * fVar217;
  auVar328._12_4_ = fVar310 * fVar215;
  auVar364._8_4_ = auVar304._8_4_;
  auVar364._0_8_ = auVar304._0_8_;
  auVar364._12_4_ = auVar304._12_4_;
  auVar193 = minps(auVar364,auVar378);
  auVar389._8_4_ = auVar264._8_4_;
  auVar389._0_8_ = auVar264._0_8_;
  auVar389._12_4_ = auVar264._12_4_;
  auVar390 = minps(auVar389,auVar328);
  auVar323 = minps(auVar193,auVar390);
  auVar235 = maxps(auVar378,auVar304);
  auVar193 = maxps(auVar328,auVar264);
  auVar172 = maxps(auVar193,auVar235);
  auVar305._8_4_ = auVar182._8_4_;
  auVar305._0_8_ = auVar182._0_8_;
  auVar305._12_4_ = auVar182._12_4_;
  auVar235 = minps(auVar305,auVar344);
  auVar265._8_4_ = auVar140._8_4_;
  auVar265._0_8_ = auVar140._0_8_;
  auVar265._12_4_ = auVar140._12_4_;
  auVar193 = minps(auVar265,auVar268);
  auVar235 = minps(auVar235,auVar193);
  auVar205 = maxps(auVar344,auVar182);
  auVar193 = maxps(auVar268,auVar140);
  auVar193 = maxps(auVar193,auVar205);
  auVar306._0_4_ = auVar323._4_4_ + auVar323._0_4_ + fVar294;
  auVar306._4_4_ = auVar235._4_4_ + auVar235._0_4_ + fVar266;
  auVar306._8_4_ = auVar323._8_4_ + auVar323._4_4_ + fVar267;
  auVar306._12_4_ = auVar323._12_4_ + auVar235._4_4_ + fVar365;
  fVar190 = auVar172._4_4_ + auVar172._0_4_ + fVar294;
  fVar215 = auVar193._4_4_ + auVar193._0_4_ + fVar266;
  auVar141._4_4_ = fVar215;
  auVar141._0_4_ = fVar190;
  auVar178 = maxps(_local_3f8,auVar306);
  auVar141._8_4_ = auVar172._8_4_ + auVar172._4_4_ + fVar267;
  auVar141._12_4_ = auVar172._12_4_ + auVar193._4_4_ + fVar365;
  auVar193 = minps(auVar141,auVar288);
  iVar149 = -(uint)(auVar193._0_4_ < auVar178._0_4_);
  iVar184 = -(uint)(auVar193._4_4_ < auVar178._4_4_);
  auVar142._4_4_ = iVar184;
  auVar142._0_4_ = iVar149;
  auVar142._8_4_ = iVar184;
  auVar142._12_4_ = iVar184;
  auVar136._8_8_ = auVar142._8_8_;
  auVar136._4_4_ = (float)iVar149;
  auVar136._0_4_ = (float)iVar149;
  iVar149 = movmskpd((uint)(fVar189 < 0.0),auVar136);
  auVar133 = _local_3f8;
  if (iVar149 != 0) goto LAB_0036bddd;
  bVar104 = 0;
  if ((fVar146 < auVar306._0_4_) && (fVar190 < fVar147)) {
    bVar104 = -(fVar215 < (float)local_428._4_4_) & (float)local_428._0_4_ < auVar306._4_4_;
  }
  bVar104 = bVar113 | bVar104;
  uVar106 = (ulong)CONCAT31(uVar37,bVar104);
  if (bVar104 != 1) goto LAB_0036b77a;
  paVar107 = (anon_union_16_2_47237d3f_for_Vec3fx_0 *)0xc9;
  do {
    paVar107 = (anon_union_16_2_47237d3f_for_Vec3fx_0 *)((long)paVar107 + -1);
    auVar390 = local_b8;
    if (paVar107 == (anon_union_16_2_47237d3f_for_Vec3fx_0 *)0x0) goto LAB_0036bddd;
    fVar118 = 1.0 - fVar294;
    fVar215 = fVar294 * fVar294 * fVar294;
    fVar190 = fVar294 * fVar294 * 3.0 * fVar118;
    fVar367 = fVar118 * fVar118 * fVar118;
    fVar217 = fVar294 * 3.0 * fVar118 * fVar118;
    fVar118 = fVar367 * (float)local_2a8 +
              fVar217 * local_2b8 + fVar190 * (float)local_2c8 + fVar215 * local_b8._0_4_;
    fVar146 = fVar367 * local_2a8._4_4_ +
              fVar217 * fStack_2b4 + fVar190 * local_2c8._4_4_ + fVar215 * local_b8._4_4_;
    fVar147 = fVar367 * fStack_2a0 +
              fVar217 * (float)uStack_2b0 + fVar190 * fStack_2c0 + fVar215 * local_b8._8_4_;
    fVar190 = fVar367 * fStack_29c +
              fVar217 * uStack_2b0._4_4_ + fVar190 * fStack_2bc + fVar215 * local_b8._12_4_;
    fVar215 = (fVar147 - fVar118) * fVar266;
    fVar217 = (fVar190 - fVar146) * fVar266;
    fVar367 = (fVar147 - fVar118) * fVar266 + fVar118;
    fVar147 = (fVar190 - fVar146) * fVar266 + fVar146;
    fVar294 = fVar294 - (fVar147 * fVar357 + fVar367 * fVar345);
    fVar266 = fVar266 - (fVar147 * fVar289 + fVar367 * fVar232);
    fVar190 = ABS(fVar147);
    auVar136._0_8_ = CONCAT44(fVar147,fVar367) & 0x7fffffff7fffffff;
    auVar136._8_4_ = ABS(fVar215 + fVar118);
    auVar136._12_4_ = ABS(fVar217 + fVar146);
    auVar178._0_8_ = CONCAT44(fVar147,fVar147) & 0x7fffffff7fffffff;
    auVar178._8_4_ = fVar190;
    auVar178._12_4_ = fVar190;
    if (fVar190 <= ABS(fVar367)) {
      auVar178._0_4_ = ABS(fVar367);
    }
  } while (local_c8 <= auVar178._0_4_);
  if ((((fVar294 < 0.0) || (1.0 < fVar294)) ||
      (auVar178._4_4_ = fVar266, auVar178._0_4_ = fVar266, auVar178._8_4_ = fVar266,
      auVar178._12_4_ = fVar266, fVar266 < 0.0)) || (1.0 < fVar266)) goto LAB_0036bddd;
  fVar367 = (pre->ray_space).vx.field_0.m128[2];
  fVar118 = (pre->ray_space).vy.field_0.m128[2];
  fVar146 = (pre->ray_space).vz.field_0.m128[2];
  fVar147 = (ray->super_RayK<1>).org.field_0.m128[0];
  fVar190 = (ray->super_RayK<1>).org.field_0.m128[1];
  fVar215 = (ray->super_RayK<1>).org.field_0.m128[2];
  fVar217 = (ray->super_RayK<1>).org.field_0.m128[3];
  auVar143._0_4_ = (local_398 - fVar147) * fVar367;
  auVar143._4_4_ = (fStack_394 - fVar190) * fVar118;
  auVar143._8_4_ = (fStack_390 - fVar215) * fVar146;
  auVar143._12_4_ = (fStack_38c - fVar217) * 0.0;
  auVar144._8_8_ = auVar143._8_8_;
  auVar144._0_8_ = auVar144._8_8_;
  auVar136._4_12_ = auVar144._4_12_;
  fVar231 = 1.0 - fVar266;
  fVar189 = 1.0 - fVar294;
  fVar218 = fVar189 * fVar189 * fVar189;
  fVar219 = fVar294 * 3.0 * fVar189 * fVar189;
  fVar230 = fVar294 * fVar294 * fVar294;
  fVar229 = fVar294 * fVar294 * 3.0 * fVar189;
  auVar136._0_4_ =
       ((auVar143._8_4_ + auVar143._4_4_ + auVar143._0_4_) * fVar231 +
       ((fStack_380 - fVar215) * fVar146 +
       (fStack_384 - fVar190) * fVar118 + (local_388 - fVar147) * fVar367) * fVar266) * fVar218 +
       (((fStack_3a0 - fVar215) * fVar146 +
        (fStack_3a4 - fVar190) * fVar118 + (local_3a8 - fVar147) * fVar367) * fVar231 +
       ((fStack_370 - fVar215) * fVar146 +
       (fStack_374 - fVar190) * fVar118 + (local_378 - fVar147) * fVar367) * fVar266) * fVar219 +
       (((fStack_3c0 - fVar215) * fVar146 +
        (fStack_3c4 - fVar190) * fVar118 + (local_3c8 - fVar147) * fVar367) * fVar231 +
       ((local_3dc.m128[3] - fVar215) * fVar146 +
       (local_3dc.m128[2] - fVar190) * fVar118 + (local_3dc.m128[1] - fVar147) * fVar367) * fVar266)
       * fVar229 +
       (fVar231 * ((fStack_3b0 - fVar215) * fVar146 +
                  (fStack_3b4 - fVar190) * fVar118 + (local_3b8 - fVar147) * fVar367) +
       ((fStack_210 - fVar215) * fVar146 +
       (fStack_214 - fVar190) * fVar118 + (local_218 - fVar147) * fVar367) * fVar266) * fVar230;
  if (auVar136._0_4_ < fVar217) goto LAB_0036bddd;
  fVar367 = (ray->super_RayK<1>).tfar;
  auVar390 = ZEXT416((uint)fVar367);
  if (fVar367 < auVar136._0_4_) goto LAB_0036bddd;
  fVar215 = 1.0 - fVar266;
  fVar217 = 1.0 - fVar266;
  fVar231 = 1.0 - fVar266;
  fVar255 = 1.0 - fVar266;
  fVar118 = local_3a8 * fVar215 + local_378 * fVar266;
  fVar146 = fStack_3a4 * fVar217 + fStack_374 * fVar266;
  fVar147 = fStack_3a0 * fVar231 + fStack_370 * fVar266;
  fVar190 = fStack_39c * fVar255 + fStack_36c * fVar266;
  fVar267 = local_3c8 * fVar215 + local_3dc.m128[1] * fVar266;
  fVar289 = fStack_3c4 * fVar217 + local_3dc.m128[2] * fVar266;
  fVar345 = fStack_3c0 * fVar231 + local_3dc.m128[3] * fVar266;
  fVar233 = fStack_3bc * fVar255 + fStack_3cc * fVar266;
  fVar357 = fVar267 - fVar118;
  fVar365 = fVar289 - fVar146;
  fVar232 = fVar345 - fVar147;
  fVar308 = fVar233 - fVar190;
  auVar178._4_4_ = fVar294;
  auVar178._0_4_ = fVar294;
  auVar178._8_4_ = fVar294;
  auVar178._12_4_ = fVar294;
  fVar118 = (((fVar118 - (local_398 * fVar215 + local_388 * fVar266)) * fVar189 + fVar294 * fVar357)
             * fVar189 +
            (fVar357 * fVar189 + ((fVar215 * local_3b8 + fVar266 * local_218) - fVar267) * fVar294)
            * fVar294) * 3.0;
  fVar146 = (((fVar146 - (fStack_394 * fVar217 + fStack_384 * fVar266)) * fVar189 +
             fVar294 * fVar365) * fVar189 +
            (fVar365 * fVar189 + ((fVar217 * fStack_3b4 + fVar266 * fStack_214) - fVar289) * fVar294
            ) * fVar294) * 3.0;
  fVar147 = (((fVar147 - (fStack_390 * fVar231 + fStack_380 * fVar266)) * fVar189 +
             fVar294 * fVar232) * fVar189 +
            (fVar232 * fVar189 + ((fVar231 * fStack_3b0 + fVar266 * fStack_210) - fVar345) * fVar294
            ) * fVar294) * 3.0;
  fVar190 = (((fVar190 - (fStack_38c * fVar255 + fStack_37c * fVar266)) * fVar189 +
             fVar294 * fVar308) * fVar189 +
            (fVar308 * fVar189 + ((fVar255 * fStack_3ac + fVar266 * fStack_20c) - fVar233) * fVar294
            ) * fVar294) * 3.0;
  pGVar23 = (context->scene->geometries).items[local_3e8].ptr;
  uVar114 = (ray->super_RayK<1>).mask;
  paVar107 = (anon_union_16_2_47237d3f_for_Vec3fx_0 *)(ulong)uVar114;
  if ((pGVar23->mask & uVar114) == 0) goto LAB_0036bddd;
  fVar215 = fVar218 * local_188 + fVar219 * local_198 + fVar229 * local_1a8 + fVar230 * local_1b8;
  fVar217 = fVar218 * fStack_184 +
            fVar219 * fStack_194 + fVar229 * fStack_1a4 + fVar230 * fStack_1b4;
  fVar189 = fVar218 * fStack_180 +
            fVar219 * fStack_190 + fVar229 * fStack_1a0 + fVar230 * fStack_1b0;
  fVar218 = fVar218 * fStack_17c +
            fVar219 * fStack_18c + fVar229 * fStack_19c + fVar230 * fStack_1ac;
  auVar178._0_4_ = fVar217 * fVar118 - fVar146 * fVar215;
  auVar178._4_4_ = fVar189 * fVar146 - fVar147 * fVar217;
  auVar178._8_4_ = fVar215 * fVar147 - fVar118 * fVar189;
  auVar178._12_4_ = fVar218 * fVar190 - fVar190 * fVar218;
  uVar220 = CONCAT44(auVar178._8_4_,auVar178._4_4_);
  if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
     (pGVar23->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
    (ray->super_RayK<1>).tfar = auVar136._0_4_;
    *(undefined8 *)&(ray->Ng).field_0 = uVar220;
    (ray->Ng).field_0.field_0.z = auVar178._0_4_;
    ray->u = fVar294;
    ray->v = fVar266;
    ray->primID = (uint)local_350;
    ray->geomID = (uint)fVar269;
    ray->instID[0] = context->user->instID[0];
    uVar114 = context->user->instPrimID[0];
    ray->instPrimID[0] = uVar114;
    paVar107 = (anon_union_16_2_47237d3f_for_Vec3fx_0 *)(ulong)uVar114;
    goto LAB_0036bddd;
  }
  local_1f8 = uVar220;
  local_1f0 = auVar178._0_4_;
  local_1ec = fVar294;
  fStack_1e8 = fVar266;
  local_1e4 = (uint)local_350;
  local_1e0 = fVar269;
  local_1dc = context->user->instID[0];
  local_1d8 = context->user->instPrimID[0];
  (ray->super_RayK<1>).tfar = auVar136._0_4_;
  local_3dc.m128[0] = -NAN;
  local_288.valid = (int *)&local_3dc;
  local_288.geometryUserPtr = pGVar23->userPtr;
  local_288.context = context->user;
  local_288.ray = (RTCRayN *)ray;
  local_288.hit = (RTCHitN *)&local_1f8;
  local_288.N = 1;
  if (pGVar23->intersectionFilterN != (RTCFilterFunctionN)0x0) {
    (*pGVar23->intersectionFilterN)(&local_288);
    auVar178._8_8_ = extraout_XMM1_Qb;
    auVar178._0_8_ = extraout_XMM1_Qa;
    if (*(float *)local_288.valid == 0.0) goto LAB_0036ce6b;
  }
  p_Var28 = context->args->filter;
  if ((p_Var28 != (RTCFilterFunctionN)0x0) &&
     (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
       RTC_RAY_QUERY_FLAG_INCOHERENT || (((pGVar23->field_8).field_0x2 & 0x40) != 0)))) {
    (*p_Var28)(&local_288);
    auVar178._8_8_ = extraout_XMM1_Qb_00;
    auVar178._0_8_ = extraout_XMM1_Qa_00;
    if (*(float *)local_288.valid == 0.0) {
LAB_0036ce6b:
      auVar136 = ZEXT416((uint)fVar367);
      (ray->super_RayK<1>).tfar = fVar367;
      paVar107 = (anon_union_16_2_47237d3f_for_Vec3fx_0 *)local_288.valid;
      goto LAB_0036bddd;
    }
  }
  *(float *)((long)local_288.ray + 0x30) = *(float *)local_288.hit;
  *(float *)((long)local_288.ray + 0x34) = *(float *)(local_288.hit + 4);
  *(float *)((long)local_288.ray + 0x38) = *(float *)(local_288.hit + 8);
  *(float *)((long)local_288.ray + 0x3c) = *(float *)(local_288.hit + 0xc);
  auVar136 = ZEXT416((uint)*(float *)(local_288.hit + 0x10));
  *(float *)((long)local_288.ray + 0x40) = *(float *)(local_288.hit + 0x10);
  *(float *)((long)local_288.ray + 0x44) = *(float *)(local_288.hit + 0x14);
  *(float *)((long)local_288.ray + 0x48) = *(float *)(local_288.hit + 0x18);
  *(float *)((long)local_288.ray + 0x4c) = *(float *)(local_288.hit + 0x1c);
  *(float *)((long)local_288.ray + 0x50) = *(float *)(local_288.hit + 0x20);
  paVar107 = (anon_union_16_2_47237d3f_for_Vec3fx_0 *)local_288.ray;
  goto LAB_0036bddd;
}

Assistant:

static __forceinline void intersect_n(const Precalculations& pre, RayHit& ray, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(normal.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          const TensorLinearCubicBezierSurface3fa curve = geom->getNormalOrientedCurve<typename Intersector::SourceCurve3ff, typename Intersector::SourceCurve3fa, TensorLinearCubicBezierSurface3fa>(context, ray.org, primID,ray.time());
          Intersector().intersect(pre,ray,context,geom,primID,curve,Epilog(ray,context,geomID,primID));
          mask &= movemask(tNear <= vfloat<M>(ray.tfar));
        }
      }